

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  ulong uVar93;
  int iVar94;
  ulong uVar95;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  uint uVar96;
  long lVar97;
  byte bVar98;
  ulong uVar99;
  uint uVar100;
  uint uVar101;
  uint uVar164;
  uint uVar165;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  uint uVar166;
  uint uVar170;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  float pp;
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar188;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar189 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar225;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar240 [32];
  float fVar247;
  float fVar255;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar261 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  float fVar271;
  float fVar278;
  undefined1 auVar274 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar275 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  float s;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_cb0;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar2 = prim[1];
  uVar95 = (ulong)(byte)PVar2;
  fVar225 = *(float *)(prim + uVar95 * 0x19 + 0x12);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar23 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar106 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + uVar95 * 0x19 + 6));
  fVar224 = fVar225 * auVar106._0_4_;
  fVar171 = fVar225 * auVar23._0_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar95 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar95 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar22);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar95 * 6 + 6);
  auVar118 = vpmovsxbd_avx2(auVar102);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar95 * 0xb + 6);
  auVar119 = vpmovsxbd_avx2(auVar111);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar122 = vpmovsxbd_avx2(auVar1);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vcvtdq2ps_avx(auVar122);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar95 + 6);
  auVar116 = vpmovsxbd_avx2(auVar103);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar93 = (ulong)(uint)((int)(uVar95 * 9) * 2);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar121 = vpmovsxbd_avx2(auVar110);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 6);
  auVar123 = vpmovsxbd_avx2(auVar104);
  auVar123 = vcvtdq2ps_avx(auVar123);
  uVar99 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar114 = vpmovsxbd_avx2(auVar105);
  auVar124 = vcvtdq2ps_avx(auVar114);
  auVar134._4_4_ = fVar171;
  auVar134._0_4_ = fVar171;
  auVar134._8_4_ = fVar171;
  auVar134._12_4_ = fVar171;
  auVar134._16_4_ = fVar171;
  auVar134._20_4_ = fVar171;
  auVar134._24_4_ = fVar171;
  auVar134._28_4_ = fVar171;
  auVar136._8_4_ = 1;
  auVar136._0_8_ = 0x100000001;
  auVar136._12_4_ = 1;
  auVar136._16_4_ = 1;
  auVar136._20_4_ = 1;
  auVar136._24_4_ = 1;
  auVar136._28_4_ = 1;
  auVar112 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar126 = ZEXT1632(CONCAT412(fVar225 * auVar23._12_4_,
                                CONCAT48(fVar225 * auVar23._8_4_,
                                         CONCAT44(fVar225 * auVar23._4_4_,fVar171))));
  auVar125 = vpermps_avx2(auVar136,auVar126);
  auVar113 = vpermps_avx512vl(auVar112,auVar126);
  fVar171 = auVar113._0_4_;
  fVar241 = auVar113._4_4_;
  auVar126._4_4_ = fVar241 * auVar118._4_4_;
  auVar126._0_4_ = fVar171 * auVar118._0_4_;
  fVar242 = auVar113._8_4_;
  auVar126._8_4_ = fVar242 * auVar118._8_4_;
  fVar243 = auVar113._12_4_;
  auVar126._12_4_ = fVar243 * auVar118._12_4_;
  fVar244 = auVar113._16_4_;
  auVar126._16_4_ = fVar244 * auVar118._16_4_;
  fVar245 = auVar113._20_4_;
  auVar126._20_4_ = fVar245 * auVar118._20_4_;
  fVar246 = auVar113._24_4_;
  auVar126._24_4_ = fVar246 * auVar118._24_4_;
  auVar126._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar116._4_4_ * fVar241;
  auVar122._0_4_ = auVar116._0_4_ * fVar171;
  auVar122._8_4_ = auVar116._8_4_ * fVar242;
  auVar122._12_4_ = auVar116._12_4_ * fVar243;
  auVar122._16_4_ = auVar116._16_4_ * fVar244;
  auVar122._20_4_ = auVar116._20_4_ * fVar245;
  auVar122._24_4_ = auVar116._24_4_ * fVar246;
  auVar122._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = auVar124._4_4_ * fVar241;
  auVar114._0_4_ = auVar124._0_4_ * fVar171;
  auVar114._8_4_ = auVar124._8_4_ * fVar242;
  auVar114._12_4_ = auVar124._12_4_ * fVar243;
  auVar114._16_4_ = auVar124._16_4_ * fVar244;
  auVar114._20_4_ = auVar124._20_4_ * fVar245;
  auVar114._24_4_ = auVar124._24_4_ * fVar246;
  auVar114._28_4_ = auVar113._28_4_;
  auVar21 = vfmadd231ps_fma(auVar126,auVar125,auVar115);
  auVar22 = vfmadd231ps_fma(auVar122,auVar125,auVar120);
  auVar102 = vfmadd231ps_fma(auVar114,auVar123,auVar125);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar134,auVar117);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar134,auVar119);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar121,auVar134);
  auVar135._4_4_ = fVar224;
  auVar135._0_4_ = fVar224;
  auVar135._8_4_ = fVar224;
  auVar135._12_4_ = fVar224;
  auVar135._16_4_ = fVar224;
  auVar135._20_4_ = fVar224;
  auVar135._24_4_ = fVar224;
  auVar135._28_4_ = fVar224;
  auVar114 = ZEXT1632(CONCAT412(fVar225 * auVar106._12_4_,
                                CONCAT48(fVar225 * auVar106._8_4_,
                                         CONCAT44(fVar225 * auVar106._4_4_,fVar224))));
  auVar122 = vpermps_avx2(auVar136,auVar114);
  auVar114 = vpermps_avx512vl(auVar112,auVar114);
  fVar225 = auVar114._0_4_;
  fVar171 = auVar114._4_4_;
  auVar125._4_4_ = fVar171 * auVar118._4_4_;
  auVar125._0_4_ = fVar225 * auVar118._0_4_;
  fVar241 = auVar114._8_4_;
  auVar125._8_4_ = fVar241 * auVar118._8_4_;
  fVar242 = auVar114._12_4_;
  auVar125._12_4_ = fVar242 * auVar118._12_4_;
  fVar243 = auVar114._16_4_;
  auVar125._16_4_ = fVar243 * auVar118._16_4_;
  fVar244 = auVar114._20_4_;
  auVar125._20_4_ = fVar244 * auVar118._20_4_;
  fVar245 = auVar114._24_4_;
  auVar125._24_4_ = fVar245 * auVar118._24_4_;
  auVar125._28_4_ = 1;
  auVar112._4_4_ = auVar116._4_4_ * fVar171;
  auVar112._0_4_ = auVar116._0_4_ * fVar225;
  auVar112._8_4_ = auVar116._8_4_ * fVar241;
  auVar112._12_4_ = auVar116._12_4_ * fVar242;
  auVar112._16_4_ = auVar116._16_4_ * fVar243;
  auVar112._20_4_ = auVar116._20_4_ * fVar244;
  auVar112._24_4_ = auVar116._24_4_ * fVar245;
  auVar112._28_4_ = auVar118._28_4_;
  auVar116._4_4_ = auVar124._4_4_ * fVar171;
  auVar116._0_4_ = auVar124._0_4_ * fVar225;
  auVar116._8_4_ = auVar124._8_4_ * fVar241;
  auVar116._12_4_ = auVar124._12_4_ * fVar242;
  auVar116._16_4_ = auVar124._16_4_ * fVar243;
  auVar116._20_4_ = auVar124._20_4_ * fVar244;
  auVar116._24_4_ = auVar124._24_4_ * fVar245;
  auVar116._28_4_ = auVar114._28_4_;
  auVar111 = vfmadd231ps_fma(auVar125,auVar122,auVar115);
  auVar1 = vfmadd231ps_fma(auVar112,auVar122,auVar120);
  auVar103 = vfmadd231ps_fma(auVar116,auVar122,auVar123);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar135,auVar117);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar135,auVar119);
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar135,auVar121);
  auVar117 = vandps_avx(ZEXT1632(auVar21),auVar131);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  uVar93 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar93 & 1);
  auVar113._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._0_4_;
  bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._4_4_;
  bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._8_4_;
  bVar7 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar21._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar22),auVar131);
  uVar93 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar93 & 1);
  auVar127._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar22._0_4_;
  bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar127._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar22._4_4_;
  bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar127._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar22._8_4_;
  bVar7 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar127._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar22._12_4_;
  auVar127._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar127._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar127._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar127._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar102),auVar131);
  uVar93 = vcmpps_avx512vl(auVar117,auVar133,1);
  bVar7 = (bool)((byte)uVar93 & 1);
  auVar117._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar102._0_4_;
  bVar7 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar102._4_4_;
  bVar7 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar102._8_4_;
  bVar7 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar102._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar115 = vrcp14ps_avx512vl(auVar113);
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = 0x3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar113,auVar115,auVar132);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar115,auVar115);
  auVar115 = vrcp14ps_avx512vl(auVar127);
  auVar22 = vfnmadd213ps_fma(auVar127,auVar115,auVar132);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar115,auVar115);
  auVar115 = vrcp14ps_avx512vl(auVar117);
  auVar102 = vfnmadd213ps_fma(auVar117,auVar115,auVar132);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar115,auVar115);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar111));
  auVar121._4_4_ = auVar21._4_4_ * auVar117._4_4_;
  auVar121._0_4_ = auVar21._0_4_ * auVar117._0_4_;
  auVar121._8_4_ = auVar21._8_4_ * auVar117._8_4_;
  auVar121._12_4_ = auVar21._12_4_ * auVar117._12_4_;
  auVar121._16_4_ = auVar117._16_4_ * 0.0;
  auVar121._20_4_ = auVar117._20_4_ * 0.0;
  auVar121._24_4_ = auVar117._24_4_ * 0.0;
  auVar121._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar111));
  auVar116 = vpbroadcastd_avx512vl();
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar130._0_4_ = auVar21._0_4_ * auVar117._0_4_;
  auVar130._4_4_ = auVar21._4_4_ * auVar117._4_4_;
  auVar130._8_4_ = auVar21._8_4_ * auVar117._8_4_;
  auVar130._12_4_ = auVar21._12_4_ * auVar117._12_4_;
  auVar130._16_4_ = auVar117._16_4_ * 0.0;
  auVar130._20_4_ = auVar117._20_4_ * 0.0;
  auVar130._24_4_ = auVar117._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar95 * -2 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar1));
  auVar123._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar123._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar123._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar123._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar123._16_4_ = auVar117._16_4_ * 0.0;
  auVar123._20_4_ = auVar117._20_4_ * 0.0;
  auVar123._24_4_ = auVar117._24_4_ * 0.0;
  auVar123._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar115);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar1));
  auVar129._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar129._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar129._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar129._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar129._16_4_ = auVar117._16_4_ * 0.0;
  auVar129._20_4_ = auVar117._20_4_ * 0.0;
  auVar129._24_4_ = auVar117._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + uVar95 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar103));
  auVar124._4_4_ = auVar117._4_4_ * auVar102._4_4_;
  auVar124._0_4_ = auVar117._0_4_ * auVar102._0_4_;
  auVar124._8_4_ = auVar117._8_4_ * auVar102._8_4_;
  auVar124._12_4_ = auVar117._12_4_ * auVar102._12_4_;
  auVar124._16_4_ = auVar117._16_4_ * 0.0;
  auVar124._20_4_ = auVar117._20_4_ * 0.0;
  auVar124._24_4_ = auVar117._24_4_ * 0.0;
  auVar124._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar103));
  auVar128._0_4_ = auVar102._0_4_ * auVar117._0_4_;
  auVar128._4_4_ = auVar102._4_4_ * auVar117._4_4_;
  auVar128._8_4_ = auVar102._8_4_ * auVar117._8_4_;
  auVar128._12_4_ = auVar102._12_4_ * auVar117._12_4_;
  auVar128._16_4_ = auVar117._16_4_ * 0.0;
  auVar128._20_4_ = auVar117._20_4_ * 0.0;
  auVar128._24_4_ = auVar117._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar117 = vpminsd_avx2(auVar121,auVar130);
  auVar115 = vpminsd_avx2(auVar123,auVar129);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115 = vpminsd_avx2(auVar124,auVar128);
  uVar188 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar118._4_4_ = uVar188;
  auVar118._0_4_ = uVar188;
  auVar118._8_4_ = uVar188;
  auVar118._12_4_ = uVar188;
  auVar118._16_4_ = uVar188;
  auVar118._20_4_ = uVar188;
  auVar118._24_4_ = uVar188;
  auVar118._28_4_ = uVar188;
  auVar115 = vmaxps_avx512vl(auVar115,auVar118);
  auVar117 = vmaxps_avx(auVar117,auVar115);
  auVar115._8_4_ = 0x3f7ffffa;
  auVar115._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar115._12_4_ = 0x3f7ffffa;
  auVar115._16_4_ = 0x3f7ffffa;
  auVar115._20_4_ = 0x3f7ffffa;
  auVar115._24_4_ = 0x3f7ffffa;
  auVar115._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar117,auVar115);
  auVar117 = vpmaxsd_avx2(auVar121,auVar130);
  auVar115 = vpmaxsd_avx2(auVar123,auVar129);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar115 = vpmaxsd_avx2(auVar124,auVar128);
  uVar188 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar119._4_4_ = uVar188;
  auVar119._0_4_ = uVar188;
  auVar119._8_4_ = uVar188;
  auVar119._12_4_ = uVar188;
  auVar119._16_4_ = uVar188;
  auVar119._20_4_ = uVar188;
  auVar119._24_4_ = uVar188;
  auVar119._28_4_ = uVar188;
  auVar115 = vminps_avx512vl(auVar115,auVar119);
  auVar117 = vminps_avx(auVar117,auVar115);
  auVar120._8_4_ = 0x3f800003;
  auVar120._0_8_ = 0x3f8000033f800003;
  auVar120._12_4_ = 0x3f800003;
  auVar120._16_4_ = 0x3f800003;
  auVar120._20_4_ = 0x3f800003;
  auVar120._24_4_ = 0x3f800003;
  auVar120._28_4_ = 0x3f800003;
  auVar117 = vmulps_avx512vl(auVar117,auVar120);
  uVar25 = vpcmpgtd_avx512vl(auVar116,_DAT_01fe9900);
  uVar24 = vcmpps_avx512vl(local_680,auVar117,2);
  if ((byte)((byte)uVar24 & (byte)uVar25) == 0) {
    return;
  }
  local_908 = (ulong)(byte)((byte)uVar24 & (byte)uVar25);
  local_a48 = (undefined1 (*) [32])local_240;
  auVar187 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar187);
  local_910 = prim;
LAB_01d19fa4:
  lVar97 = 0;
  for (uVar93 = local_908; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    lVar97 = lVar97 + 1;
  }
  uVar96 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar97 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar96].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar97 = *(long *)&pGVar4[1].time_range.upper;
  auVar21 = *(undefined1 (*) [16])(lVar97 + (long)p_Var5 * uVar93);
  auVar22 = *(undefined1 (*) [16])(lVar97 + (uVar93 + 1) * (long)p_Var5);
  local_908 = local_908 - 1 & local_908;
  if (local_908 != 0) {
    uVar95 = local_908 - 1 & local_908;
    for (uVar99 = local_908; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    }
    if (uVar95 != 0) {
      for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x1c);
  auVar111 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar188 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar281._4_4_ = uVar188;
  auVar281._0_4_ = uVar188;
  auVar281._8_4_ = uVar188;
  auVar281._12_4_ = uVar188;
  local_820._16_4_ = uVar188;
  local_820._0_16_ = auVar281;
  local_820._20_4_ = uVar188;
  local_820._24_4_ = uVar188;
  local_820._28_4_ = uVar188;
  uVar188 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar109._4_4_ = uVar188;
  auVar109._0_4_ = uVar188;
  auVar109._8_4_ = uVar188;
  auVar109._12_4_ = uVar188;
  local_840._16_4_ = uVar188;
  local_840._0_16_ = auVar109;
  local_840._20_4_ = uVar188;
  local_840._24_4_ = uVar188;
  local_840._28_4_ = uVar188;
  auVar102 = vunpcklps_avx(auVar281,auVar109);
  fVar225 = *(float *)(ray + k * 4 + 0x180);
  auVar285._4_4_ = fVar225;
  auVar285._0_4_ = fVar225;
  auVar285._8_4_ = fVar225;
  auVar285._12_4_ = fVar225;
  fStack_850 = fVar225;
  _local_860 = auVar285;
  fStack_84c = fVar225;
  fStack_848 = fVar225;
  register0x0000159c = fVar225;
  local_a10 = vinsertps_avx(auVar102,auVar285,0x28);
  auVar106._0_4_ = auVar21._0_4_ + auVar22._0_4_;
  auVar106._4_4_ = auVar21._4_4_ + auVar22._4_4_;
  auVar106._8_4_ = auVar21._8_4_ + auVar22._8_4_;
  auVar106._12_4_ = auVar21._12_4_ + auVar22._12_4_;
  auVar23._8_4_ = 0x3f000000;
  auVar23._0_8_ = 0x3f0000003f000000;
  auVar23._12_4_ = 0x3f000000;
  auVar102 = vmulps_avx512vl(auVar106,auVar23);
  auVar102 = vsubps_avx(auVar102,auVar111);
  auVar102 = vdpps_avx(auVar102,local_a10,0x7f);
  fVar171 = *(float *)(ray + k * 4 + 0xc0);
  auVar279 = ZEXT464((uint)fVar171);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar280 = ZEXT1664(local_a20);
  auVar107._4_12_ = ZEXT812(0) << 0x20;
  auVar107._0_4_ = local_a20._0_4_;
  auVar103 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar107);
  auVar1 = vfnmadd213ss_fma(auVar103,local_a20,ZEXT416(0x40000000));
  local_660 = auVar102._0_4_ * auVar103._0_4_ * auVar1._0_4_;
  auVar108._4_4_ = local_660;
  auVar108._0_4_ = local_660;
  auVar108._8_4_ = local_660;
  auVar108._12_4_ = local_660;
  fStack_9f0 = local_660;
  _local_a00 = auVar108;
  fStack_9ec = local_660;
  fStack_9e8 = local_660;
  fStack_9e4 = local_660;
  auVar102 = vfmadd231ps_fma(auVar111,local_a10,auVar108);
  auVar102 = vblendps_avx(auVar102,ZEXT816(0) << 0x40,8);
  auVar21 = vsubps_avx(auVar21,auVar102);
  auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar97 + (uVar93 + 2) * (long)p_Var5),auVar102);
  auVar270 = ZEXT1664(auVar111);
  auVar22 = vsubps_avx(auVar22,auVar102);
  auVar275 = ZEXT1664(auVar22);
  auVar102 = vsubps_avx(*(undefined1 (*) [16])(lVar97 + (uVar93 + 3) * (long)p_Var5),auVar102);
  auVar117 = vbroadcastss_avx512vl(auVar21);
  auVar138._8_4_ = 1;
  auVar138._0_8_ = 0x100000001;
  auVar138._12_4_ = 1;
  auVar138._16_4_ = 1;
  auVar138._20_4_ = 1;
  auVar138._24_4_ = 1;
  auVar138._28_4_ = 1;
  local_980 = ZEXT1632(auVar21);
  auVar115 = vpermps_avx512vl(auVar138,local_980);
  auVar139._8_4_ = 2;
  auVar139._0_8_ = 0x200000002;
  auVar139._12_4_ = 2;
  auVar139._16_4_ = 2;
  auVar139._20_4_ = 2;
  auVar139._24_4_ = 2;
  auVar139._28_4_ = 2;
  local_ac0 = vpermps_avx512vl(auVar139,local_980);
  auVar286 = ZEXT3264(local_ac0);
  auVar140._8_4_ = 3;
  auVar140._0_8_ = 0x300000003;
  auVar140._12_4_ = 3;
  auVar140._16_4_ = 3;
  auVar140._20_4_ = 3;
  auVar140._24_4_ = 3;
  auVar140._28_4_ = 3;
  auVar118 = vpermps_avx512vl(auVar140,local_980);
  local_ae0 = vbroadcastss_avx512vl(auVar22);
  auVar287 = ZEXT3264(local_ae0);
  local_9c0 = ZEXT1632(auVar22);
  auVar119 = vpermps_avx512vl(auVar138,local_9c0);
  local_b00 = vpermps_avx512vl(auVar139,local_9c0);
  auVar288 = ZEXT3264(local_b00);
  auVar120 = vpermps_avx512vl(auVar140,local_9c0);
  auVar116 = vbroadcastss_avx512vl(auVar111);
  local_9a0 = ZEXT1632(auVar111);
  local_b20 = vpermps_avx512vl(auVar138,local_9a0);
  auVar289 = ZEXT3264(local_b20);
  local_5c0 = vpermps_avx512vl(auVar139,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar140,local_9a0);
  local_5a0 = vbroadcastss_avx512vl(auVar102);
  _local_9e0 = ZEXT1632(auVar102);
  local_560 = vpermps_avx2(auVar138,_local_9e0);
  local_620 = vpermps_avx2(auVar139,_local_9e0);
  local_640 = vpermps_avx2(auVar140,_local_9e0);
  auVar21 = vfmadd231ps_fma(ZEXT432((uint)(fVar225 * fVar225)),local_840,local_840);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_820,local_820);
  local_580._0_4_ = auVar21._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar137._8_4_ = 0x7fffffff;
  auVar137._0_8_ = 0x7fffffff7fffffff;
  auVar137._12_4_ = 0x7fffffff;
  auVar137._16_4_ = 0x7fffffff;
  auVar137._20_4_ = 0x7fffffff;
  auVar137._24_4_ = 0x7fffffff;
  auVar137._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar137);
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar171 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar187 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar187);
  iVar94 = 1;
  uVar93 = 0;
  auVar187 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar187);
  auVar21 = vsqrtss_avx(local_a20,local_a20);
  auVar22 = vsqrtss_avx(local_a20,local_a20);
  local_730 = ZEXT816(0x3f80000000000000);
  auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar187 = ZEXT3264(auVar121);
  local_600 = local_5a0;
  do {
    auVar102 = vmovshdup_avx(local_730);
    auVar102 = vsubps_avx(auVar102,local_730);
    auVar178._0_4_ = auVar102._0_4_;
    fVar224 = auVar178._0_4_ * 0.04761905;
    uVar188 = local_730._0_4_;
    auVar250._4_4_ = uVar188;
    auVar250._0_4_ = uVar188;
    auVar250._8_4_ = uVar188;
    auVar250._12_4_ = uVar188;
    auVar250._16_4_ = uVar188;
    auVar250._20_4_ = uVar188;
    auVar250._24_4_ = uVar188;
    auVar250._28_4_ = uVar188;
    auVar178._4_4_ = auVar178._0_4_;
    auVar178._8_4_ = auVar178._0_4_;
    auVar178._12_4_ = auVar178._0_4_;
    auVar178._16_4_ = auVar178._0_4_;
    auVar178._20_4_ = auVar178._0_4_;
    auVar178._24_4_ = auVar178._0_4_;
    auVar178._28_4_ = auVar178._0_4_;
    auVar102 = vfmadd231ps_fma(auVar250,auVar178,_DAT_01faff20);
    auVar121 = vsubps_avx512vl(auVar187._0_32_,ZEXT1632(auVar102));
    fVar247 = auVar102._0_4_;
    fVar253 = auVar102._4_4_;
    fVar254 = auVar102._8_4_;
    fVar255 = auVar102._12_4_;
    fVar257 = auVar121._0_4_;
    fVar258 = auVar121._4_4_;
    fVar262 = auVar121._8_4_;
    fVar263 = auVar121._12_4_;
    fVar264 = auVar121._16_4_;
    fVar265 = auVar121._20_4_;
    fVar266 = auVar121._24_4_;
    auVar148._4_4_ = fVar258 * fVar258 * -fVar253;
    auVar148._0_4_ = fVar257 * fVar257 * -fVar247;
    auVar148._8_4_ = fVar262 * fVar262 * -fVar254;
    auVar148._12_4_ = fVar263 * fVar263 * -fVar255;
    auVar148._16_4_ = fVar264 * fVar264 * -0.0;
    auVar148._20_4_ = fVar265 * fVar265 * -0.0;
    auVar148._24_4_ = fVar266 * fVar266 * -0.0;
    auVar148._28_4_ = 0x80000000;
    auVar187._28_36_ = auVar270._28_36_;
    auVar187._0_28_ =
         ZEXT1628(CONCAT412(fVar255 * fVar255,
                            CONCAT48(fVar254 * fVar254,CONCAT44(fVar253 * fVar253,fVar247 * fVar247)
                                    )));
    fVar271 = fVar247 * 3.0;
    fVar276 = fVar253 * 3.0;
    fVar277 = fVar254 * 3.0;
    fVar278 = fVar255 * 3.0;
    auVar270._28_36_ = auVar275._28_36_;
    auVar270._0_28_ = ZEXT1628(CONCAT412(fVar278,CONCAT48(fVar277,CONCAT44(fVar276,fVar271))));
    auVar204._0_4_ = (fVar271 + -5.0) * fVar247 * fVar247;
    auVar204._4_4_ = (fVar276 + -5.0) * fVar253 * fVar253;
    auVar204._8_4_ = (fVar277 + -5.0) * fVar254 * fVar254;
    auVar204._12_4_ = (fVar278 + -5.0) * fVar255 * fVar255;
    auVar204._16_4_ = 0x80000000;
    auVar204._20_4_ = 0x80000000;
    auVar204._24_4_ = 0x80000000;
    auVar204._28_4_ = 0;
    auVar122 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar123 = vaddps_avx512vl(auVar204,auVar122);
    auVar163._0_4_ = fVar257 * fVar257;
    auVar163._4_4_ = fVar258 * fVar258;
    auVar163._8_4_ = fVar262 * fVar262;
    auVar163._12_4_ = fVar263 * fVar263;
    auVar163._16_4_ = fVar264 * fVar264;
    auVar163._20_4_ = fVar265 * fVar265;
    auVar163._28_36_ = auVar279._28_36_;
    auVar163._24_4_ = fVar266 * fVar266;
    auVar149._4_4_ = auVar163._4_4_ * (fVar258 * 3.0 + -5.0);
    auVar149._0_4_ = auVar163._0_4_ * (fVar257 * 3.0 + -5.0);
    auVar149._8_4_ = auVar163._8_4_ * (fVar262 * 3.0 + -5.0);
    auVar149._12_4_ = auVar163._12_4_ * (fVar263 * 3.0 + -5.0);
    auVar149._16_4_ = auVar163._16_4_ * (fVar264 * 3.0 + -5.0);
    auVar149._20_4_ = auVar163._20_4_ * (fVar265 * 3.0 + -5.0);
    auVar149._24_4_ = auVar163._24_4_ * (fVar266 * 3.0 + -5.0);
    auVar149._28_4_ = auVar280._28_4_ + -5.0;
    auVar124 = vaddps_avx512vl(auVar149,auVar122);
    fVar256 = auVar121._28_4_;
    auVar240._4_4_ = fVar253 * fVar253 * -fVar258;
    auVar240._0_4_ = fVar247 * fVar247 * -fVar257;
    auVar240._8_4_ = fVar254 * fVar254 * -fVar262;
    auVar240._12_4_ = fVar255 * fVar255 * -fVar263;
    auVar240._16_4_ = -fVar264 * 0.0 * 0.0;
    auVar240._20_4_ = -fVar265 * 0.0 * 0.0;
    auVar240._24_4_ = -fVar266 * 0.0 * 0.0;
    auVar240._28_4_ = -fVar256;
    auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar121 = vmulps_avx512vl(auVar148,auVar114);
    auVar125 = vmulps_avx512vl(auVar123,auVar114);
    auVar124 = vmulps_avx512vl(auVar124,auVar114);
    auVar126 = vmulps_avx512vl(auVar240,auVar114);
    auVar112 = vmulps_avx512vl(local_600,auVar126);
    fVar225 = auVar126._0_4_;
    fVar241 = auVar126._4_4_;
    auVar44._4_4_ = local_560._4_4_ * fVar241;
    auVar44._0_4_ = local_560._0_4_ * fVar225;
    fVar242 = auVar126._8_4_;
    auVar44._8_4_ = local_560._8_4_ * fVar242;
    fVar243 = auVar126._12_4_;
    auVar44._12_4_ = local_560._12_4_ * fVar243;
    fVar244 = auVar126._16_4_;
    auVar44._16_4_ = local_560._16_4_ * fVar244;
    fVar245 = auVar126._20_4_;
    auVar44._20_4_ = local_560._20_4_ * fVar245;
    fVar246 = auVar126._24_4_;
    auVar44._24_4_ = local_560._24_4_ * fVar246;
    auVar44._28_4_ = auVar123._28_4_;
    auVar45._4_4_ = local_620._4_4_ * fVar241;
    auVar45._0_4_ = local_620._0_4_ * fVar225;
    auVar45._8_4_ = local_620._8_4_ * fVar242;
    auVar45._12_4_ = local_620._12_4_ * fVar243;
    auVar45._16_4_ = local_620._16_4_ * fVar244;
    auVar45._20_4_ = local_620._20_4_ * fVar245;
    auVar45._24_4_ = local_620._24_4_ * fVar246;
    auVar45._28_4_ = local_560._28_4_;
    auVar46._4_4_ = local_640._4_4_ * fVar241;
    auVar46._0_4_ = local_640._0_4_ * fVar225;
    auVar46._8_4_ = local_640._8_4_ * fVar242;
    auVar46._12_4_ = local_640._12_4_ * fVar243;
    auVar46._16_4_ = local_640._16_4_ * fVar244;
    auVar46._20_4_ = local_640._20_4_ * fVar245;
    auVar46._24_4_ = local_640._24_4_ * fVar246;
    auVar46._28_4_ = auVar126._28_4_;
    auVar123 = vfmadd231ps_avx512vl(auVar112,auVar124,auVar116);
    auVar126 = vfmadd231ps_avx512vl(auVar44,auVar124,auVar289._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar45,auVar124,local_5c0);
    auVar124 = vfmadd231ps_avx512vl(auVar46,local_5e0,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar287._0_32_);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar119);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,auVar288._0_32_);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar125);
    auVar113 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar117);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar121,auVar115);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar121,auVar286._0_32_);
    auVar127 = vfmadd231ps_avx512vl(auVar124,auVar118,auVar121);
    auVar47._4_4_ = (fVar258 + fVar258) * fVar253;
    auVar47._0_4_ = (fVar257 + fVar257) * fVar247;
    auVar47._8_4_ = (fVar262 + fVar262) * fVar254;
    auVar47._12_4_ = (fVar263 + fVar263) * fVar255;
    auVar47._16_4_ = (fVar264 + fVar264) * 0.0;
    auVar47._20_4_ = (fVar265 + fVar265) * 0.0;
    auVar47._24_4_ = (fVar266 + fVar266) * 0.0;
    auVar47._28_4_ = auVar125._28_4_;
    auVar121 = vsubps_avx(auVar47,auVar163._0_32_);
    auVar251._0_28_ =
         ZEXT1628(CONCAT412((fVar255 + fVar255) * (fVar278 + -5.0) + fVar278 * fVar255,
                            CONCAT48((fVar254 + fVar254) * (fVar277 + -5.0) + fVar277 * fVar254,
                                     CONCAT44((fVar253 + fVar253) * (fVar276 + -5.0) +
                                              fVar276 * fVar253,
                                              (fVar247 + fVar247) * (fVar271 + -5.0) +
                                              fVar271 * fVar247))));
    auVar251._28_4_ = auVar275._28_4_ + -5.0 + 0.0;
    auVar123 = vaddps_avx512vl(auVar270._0_32_,auVar122);
    auVar48._4_4_ = (fVar258 + fVar258) * auVar123._4_4_;
    auVar48._0_4_ = (fVar257 + fVar257) * auVar123._0_4_;
    auVar48._8_4_ = (fVar262 + fVar262) * auVar123._8_4_;
    auVar48._12_4_ = (fVar263 + fVar263) * auVar123._12_4_;
    auVar48._16_4_ = (fVar264 + fVar264) * auVar123._16_4_;
    auVar48._20_4_ = (fVar265 + fVar265) * auVar123._20_4_;
    auVar48._24_4_ = (fVar266 + fVar266) * auVar123._24_4_;
    auVar48._28_4_ = auVar123._28_4_;
    auVar49._4_4_ = fVar258 * 3.0 * fVar258;
    auVar49._0_4_ = fVar257 * 3.0 * fVar257;
    auVar49._8_4_ = fVar262 * 3.0 * fVar262;
    auVar49._12_4_ = fVar263 * 3.0 * fVar263;
    auVar49._16_4_ = fVar264 * 3.0 * fVar264;
    auVar49._20_4_ = fVar265 * 3.0 * fVar265;
    auVar49._24_4_ = fVar266 * 3.0 * fVar266;
    auVar49._28_4_ = fVar256;
    auVar123 = vsubps_avx(auVar48,auVar49);
    auVar124 = vsubps_avx(auVar187._0_32_,auVar47);
    auVar121 = vmulps_avx512vl(auVar121,auVar114);
    auVar128 = vmulps_avx512vl(auVar251,auVar114);
    auVar123 = vmulps_avx512vl(auVar123,auVar114);
    auVar124 = vmulps_avx512vl(auVar124,auVar114);
    auVar114 = vmulps_avx512vl(local_600,auVar124);
    auVar129 = vmulps_avx512vl(local_560,auVar124);
    auVar50._4_4_ = local_620._4_4_ * auVar124._4_4_;
    auVar50._0_4_ = local_620._0_4_ * auVar124._0_4_;
    auVar50._8_4_ = local_620._8_4_ * auVar124._8_4_;
    auVar50._12_4_ = local_620._12_4_ * auVar124._12_4_;
    auVar50._16_4_ = local_620._16_4_ * auVar124._16_4_;
    auVar50._20_4_ = local_620._20_4_ * auVar124._20_4_;
    auVar50._24_4_ = local_620._24_4_ * auVar124._24_4_;
    auVar50._28_4_ = auVar280._28_4_;
    auVar51._4_4_ = local_640._4_4_ * auVar124._4_4_;
    auVar51._0_4_ = local_640._0_4_ * auVar124._0_4_;
    auVar51._8_4_ = local_640._8_4_ * auVar124._8_4_;
    auVar51._12_4_ = local_640._12_4_ * auVar124._12_4_;
    auVar51._16_4_ = local_640._16_4_ * auVar124._16_4_;
    auVar51._20_4_ = local_640._20_4_ * auVar124._20_4_;
    auVar51._24_4_ = local_640._24_4_ * auVar124._24_4_;
    auVar51._28_4_ = auVar124._28_4_;
    auVar124 = vfmadd231ps_avx512vl(auVar114,auVar123,auVar116);
    auVar114 = vfmadd231ps_avx512vl(auVar129,auVar123,auVar289._0_32_);
    auVar129 = vfmadd231ps_avx512vl(auVar50,auVar123,local_5c0);
    auVar123 = vfmadd231ps_avx512vl(auVar51,local_5e0,auVar123);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar128,auVar287._0_32_);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar128,auVar119);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar288._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,auVar128);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar121,auVar117);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,auVar115);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar121,auVar286._0_32_);
    auVar121 = vfmadd231ps_avx512vl(auVar123,auVar118,auVar121);
    auVar52._4_4_ = auVar124._4_4_ * fVar224;
    auVar52._0_4_ = auVar124._0_4_ * fVar224;
    auVar52._8_4_ = auVar124._8_4_ * fVar224;
    auVar52._12_4_ = auVar124._12_4_ * fVar224;
    auVar52._16_4_ = auVar124._16_4_ * fVar224;
    auVar52._20_4_ = auVar124._20_4_ * fVar224;
    auVar52._24_4_ = auVar124._24_4_ * fVar224;
    auVar52._28_4_ = fVar256 + fVar256;
    auVar53._4_4_ = auVar114._4_4_ * fVar224;
    auVar53._0_4_ = auVar114._0_4_ * fVar224;
    auVar53._8_4_ = auVar114._8_4_ * fVar224;
    auVar53._12_4_ = auVar114._12_4_ * fVar224;
    auVar53._16_4_ = auVar114._16_4_ * fVar224;
    auVar53._20_4_ = auVar114._20_4_ * fVar224;
    auVar53._24_4_ = auVar114._24_4_ * fVar224;
    auVar53._28_4_ = auVar125._28_4_;
    auVar54._4_4_ = auVar128._4_4_ * fVar224;
    auVar54._0_4_ = auVar128._0_4_ * fVar224;
    auVar54._8_4_ = auVar128._8_4_ * fVar224;
    auVar54._12_4_ = auVar128._12_4_ * fVar224;
    auVar54._16_4_ = auVar128._16_4_ * fVar224;
    auVar54._20_4_ = auVar128._20_4_ * fVar224;
    auVar54._24_4_ = auVar128._24_4_ * fVar224;
    auVar54._28_4_ = 0;
    fVar225 = fVar224 * auVar121._0_4_;
    fVar241 = fVar224 * auVar121._4_4_;
    auVar55._4_4_ = fVar241;
    auVar55._0_4_ = fVar225;
    fVar242 = fVar224 * auVar121._8_4_;
    auVar55._8_4_ = fVar242;
    fVar243 = fVar224 * auVar121._12_4_;
    auVar55._12_4_ = fVar243;
    fVar244 = fVar224 * auVar121._16_4_;
    auVar55._16_4_ = fVar244;
    fVar245 = fVar224 * auVar121._20_4_;
    auVar55._20_4_ = fVar245;
    fVar246 = fVar224 * auVar121._24_4_;
    auVar55._24_4_ = fVar246;
    auVar55._28_4_ = fVar224;
    auVar102 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
    auVar125 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,ZEXT1632(auVar102));
    auVar128 = vpermt2ps_avx512vl(auVar126,_DAT_01feed00,ZEXT1632(auVar102));
    auVar279 = ZEXT3264(auVar128);
    auVar124 = ZEXT1632(auVar102);
    auVar129 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,auVar124);
    auVar280 = ZEXT3264(auVar129);
    auVar252._0_4_ = auVar127._0_4_ + fVar225;
    auVar252._4_4_ = auVar127._4_4_ + fVar241;
    auVar252._8_4_ = auVar127._8_4_ + fVar242;
    auVar252._12_4_ = auVar127._12_4_ + fVar243;
    auVar252._16_4_ = auVar127._16_4_ + fVar244;
    auVar252._20_4_ = auVar127._20_4_ + fVar245;
    auVar252._24_4_ = auVar127._24_4_ + fVar246;
    auVar252._28_4_ = auVar127._28_4_ + fVar224;
    auVar121 = vmaxps_avx(auVar127,auVar252);
    auVar123 = vminps_avx(auVar127,auVar252);
    auVar127 = vpermt2ps_avx512vl(auVar127,_DAT_01feed00,auVar124);
    auVar130 = vpermt2ps_avx512vl(auVar52,_DAT_01feed00,auVar124);
    auVar275 = ZEXT3264(auVar130);
    auVar131 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar124);
    auVar148 = ZEXT1632(auVar102);
    auVar132 = vpermt2ps_avx512vl(auVar54,_DAT_01feed00,auVar148);
    auVar124 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,auVar148);
    auVar133 = vsubps_avx512vl(auVar127,auVar124);
    auVar124 = vsubps_avx(auVar125,auVar113);
    auVar270 = ZEXT3264(auVar124);
    auVar122 = vsubps_avx(auVar128,auVar126);
    auVar114 = vsubps_avx(auVar129,auVar112);
    auVar134 = vmulps_avx512vl(auVar122,auVar54);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar53,auVar114);
    auVar135 = vmulps_avx512vl(auVar114,auVar52);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar54,auVar124);
    auVar136 = vmulps_avx512vl(auVar124,auVar53);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar52,auVar122);
    auVar136 = vmulps_avx512vl(auVar136,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar136,auVar135,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar134,auVar134);
    auVar135 = vmulps_avx512vl(auVar114,auVar114);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar122,auVar122);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar124,auVar124);
    auVar136 = vrcp14ps_avx512vl(auVar135);
    auVar137 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar187 = ZEXT3264(auVar137);
    auVar138 = vfnmadd213ps_avx512vl(auVar136,auVar135,auVar137);
    auVar136 = vfmadd132ps_avx512vl(auVar138,auVar136,auVar136);
    auVar134 = vmulps_avx512vl(auVar134,auVar136);
    auVar138 = vmulps_avx512vl(auVar122,auVar132);
    auVar138 = vfmsub231ps_avx512vl(auVar138,auVar131,auVar114);
    auVar139 = vmulps_avx512vl(auVar114,auVar130);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar132,auVar124);
    auVar140 = vmulps_avx512vl(auVar124,auVar131);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar130,auVar122);
    auVar140 = vmulps_avx512vl(auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar138 = vfmadd231ps_avx512vl(auVar139,auVar138,auVar138);
    auVar136 = vmulps_avx512vl(auVar138,auVar136);
    auVar134 = vmaxps_avx512vl(auVar134,auVar136);
    auVar134 = vsqrtps_avx512vl(auVar134);
    auVar136 = vmaxps_avx512vl(auVar133,auVar127);
    auVar121 = vmaxps_avx512vl(auVar121,auVar136);
    auVar136 = vaddps_avx512vl(auVar134,auVar121);
    auVar121 = vminps_avx512vl(auVar133,auVar127);
    auVar121 = vminps_avx(auVar123,auVar121);
    auVar121 = vsubps_avx512vl(auVar121,auVar134);
    auVar141._8_4_ = 0x3f800002;
    auVar141._0_8_ = 0x3f8000023f800002;
    auVar141._12_4_ = 0x3f800002;
    auVar141._16_4_ = 0x3f800002;
    auVar141._20_4_ = 0x3f800002;
    auVar141._24_4_ = 0x3f800002;
    auVar141._28_4_ = 0x3f800002;
    auVar123 = vmulps_avx512vl(auVar136,auVar141);
    auVar142._8_4_ = 0x3f7ffffc;
    auVar142._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar142._12_4_ = 0x3f7ffffc;
    auVar142._16_4_ = 0x3f7ffffc;
    auVar142._20_4_ = 0x3f7ffffc;
    auVar142._24_4_ = 0x3f7ffffc;
    auVar142._28_4_ = 0x3f7ffffc;
    auVar121 = vmulps_avx512vl(auVar121,auVar142);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar127 = vrsqrt14ps_avx512vl(auVar135);
    auVar143._8_4_ = 0xbf000000;
    auVar143._0_8_ = 0xbf000000bf000000;
    auVar143._12_4_ = 0xbf000000;
    auVar143._16_4_ = 0xbf000000;
    auVar143._20_4_ = 0xbf000000;
    auVar143._24_4_ = 0xbf000000;
    auVar143._28_4_ = 0xbf000000;
    auVar133 = vmulps_avx512vl(auVar135,auVar143);
    fVar225 = auVar127._0_4_;
    fVar241 = auVar127._4_4_;
    fVar242 = auVar127._8_4_;
    fVar243 = auVar127._12_4_;
    fVar244 = auVar127._16_4_;
    fVar245 = auVar127._20_4_;
    fVar246 = auVar127._24_4_;
    auVar56._4_4_ = fVar241 * fVar241 * fVar241 * auVar133._4_4_;
    auVar56._0_4_ = fVar225 * fVar225 * fVar225 * auVar133._0_4_;
    auVar56._8_4_ = fVar242 * fVar242 * fVar242 * auVar133._8_4_;
    auVar56._12_4_ = fVar243 * fVar243 * fVar243 * auVar133._12_4_;
    auVar56._16_4_ = fVar244 * fVar244 * fVar244 * auVar133._16_4_;
    auVar56._20_4_ = fVar245 * fVar245 * fVar245 * auVar133._20_4_;
    auVar56._24_4_ = fVar246 * fVar246 * fVar246 * auVar133._24_4_;
    auVar56._28_4_ = auVar136._28_4_;
    auVar144._8_4_ = 0x3fc00000;
    auVar144._0_8_ = 0x3fc000003fc00000;
    auVar144._12_4_ = 0x3fc00000;
    auVar144._16_4_ = 0x3fc00000;
    auVar144._20_4_ = 0x3fc00000;
    auVar144._24_4_ = 0x3fc00000;
    auVar144._28_4_ = 0x3fc00000;
    auVar127 = vfmadd231ps_avx512vl(auVar56,auVar127,auVar144);
    auVar133 = vmulps_avx512vl(auVar124,auVar127);
    auVar134 = vmulps_avx512vl(auVar122,auVar127);
    auVar135 = vmulps_avx512vl(auVar114,auVar127);
    auVar136 = vsubps_avx512vl(auVar148,auVar113);
    auVar138 = vsubps_avx512vl(auVar148,auVar126);
    auVar139 = vsubps_avx512vl(auVar148,auVar112);
    auVar140 = vmulps_avx512vl(_local_860,auVar139);
    auVar140 = vfmadd231ps_avx512vl(auVar140,local_840,auVar138);
    auVar140 = vfmadd231ps_avx512vl(auVar140,local_820,auVar136);
    auVar141 = vmulps_avx512vl(auVar139,auVar139);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar138,auVar138);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar136,auVar136);
    auVar142 = vmulps_avx512vl(_local_860,auVar135);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar134,local_840);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar133,local_820);
    auVar135 = vmulps_avx512vl(auVar139,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar138,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar136,auVar133);
    auVar134 = vmulps_avx512vl(auVar142,auVar142);
    auVar135 = vsubps_avx512vl(local_580,auVar134);
    auVar143 = vmulps_avx512vl(auVar142,auVar133);
    auVar140 = vsubps_avx512vl(auVar140,auVar143);
    auVar140 = vaddps_avx512vl(auVar140,auVar140);
    auVar143 = vmulps_avx512vl(auVar133,auVar133);
    auVar141 = vsubps_avx512vl(auVar141,auVar143);
    auVar123 = vsubps_avx512vl(auVar141,auVar123);
    local_a80 = vmulps_avx512vl(auVar140,auVar140);
    auVar145._8_4_ = 0x40800000;
    auVar145._0_8_ = 0x4080000040800000;
    auVar145._12_4_ = 0x40800000;
    auVar145._16_4_ = 0x40800000;
    auVar145._20_4_ = 0x40800000;
    auVar145._24_4_ = 0x40800000;
    auVar145._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar135,auVar145);
    auVar143 = vmulps_avx512vl(_local_880,auVar123);
    auVar143 = vsubps_avx512vl(local_a80,auVar143);
    uVar99 = vcmpps_avx512vl(auVar143,auVar148,5);
    bVar88 = (byte)uVar99;
    fVar225 = (float)local_a00._0_4_;
    fVar241 = (float)local_a00._4_4_;
    fVar242 = fStack_9f8;
    fVar243 = fStack_9f4;
    fVar244 = fStack_9f0;
    fVar245 = fStack_9ec;
    fVar246 = fStack_9e8;
    fVar224 = fStack_9e4;
    if (bVar88 == 0) {
LAB_01d1acdb:
      auVar286 = ZEXT3264(local_ac0);
      auVar287 = ZEXT3264(local_ae0);
      auVar288 = ZEXT3264(local_b00);
      auVar289 = ZEXT3264(local_b20);
    }
    else {
      local_800._0_32_ = auVar141;
      auVar143 = vsqrtps_avx512vl(auVar143);
      auVar144 = vaddps_avx512vl(auVar135,auVar135);
      local_8a0 = vrcp14ps_avx512vl(auVar144);
      auVar137 = vfnmadd213ps_avx512vl(local_8a0,auVar144,auVar137);
      auVar137 = vfmadd132ps_avx512vl(auVar137,local_8a0,local_8a0);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      local_8c0 = vxorps_avx512vl(auVar140,auVar36);
      auVar145 = vsubps_avx512vl(local_8c0,auVar143);
      auVar145 = vmulps_avx512vl(auVar145,auVar137);
      auVar143 = vsubps_avx512vl(auVar143,auVar140);
      local_aa0 = vmulps_avx512vl(auVar143,auVar137);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar143 = vblendmps_avx512vl(auVar137,auVar145);
      auVar146._0_4_ =
           (uint)(bVar88 & 1) * auVar143._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar137._0_4_;
      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
      auVar146._4_4_ = (uint)bVar7 * auVar143._4_4_ | (uint)!bVar7 * auVar137._4_4_;
      bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
      auVar146._8_4_ = (uint)bVar7 * auVar143._8_4_ | (uint)!bVar7 * auVar137._8_4_;
      bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
      auVar146._12_4_ = (uint)bVar7 * auVar143._12_4_ | (uint)!bVar7 * auVar137._12_4_;
      bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
      auVar146._16_4_ = (uint)bVar7 * auVar143._16_4_ | (uint)!bVar7 * auVar137._16_4_;
      bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
      auVar146._20_4_ = (uint)bVar7 * auVar143._20_4_ | (uint)!bVar7 * auVar137._20_4_;
      bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
      auVar146._24_4_ = (uint)bVar7 * auVar143._24_4_ | (uint)!bVar7 * auVar137._24_4_;
      bVar7 = SUB81(uVar99 >> 7,0);
      auVar146._28_4_ = (uint)bVar7 * auVar143._28_4_ | (uint)!bVar7 * auVar137._28_4_;
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar143 = vblendmps_avx512vl(auVar137,local_aa0);
      auVar147._0_4_ =
           (uint)(bVar88 & 1) * auVar143._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar137._0_4_;
      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
      auVar147._4_4_ = (uint)bVar7 * auVar143._4_4_ | (uint)!bVar7 * auVar137._4_4_;
      bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
      auVar147._8_4_ = (uint)bVar7 * auVar143._8_4_ | (uint)!bVar7 * auVar137._8_4_;
      bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
      auVar147._12_4_ = (uint)bVar7 * auVar143._12_4_ | (uint)!bVar7 * auVar137._12_4_;
      bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
      auVar147._16_4_ = (uint)bVar7 * auVar143._16_4_ | (uint)!bVar7 * auVar137._16_4_;
      bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
      auVar147._20_4_ = (uint)bVar7 * auVar143._20_4_ | (uint)!bVar7 * auVar137._20_4_;
      bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
      auVar147._24_4_ = (uint)bVar7 * auVar143._24_4_ | (uint)!bVar7 * auVar137._24_4_;
      bVar7 = SUB81(uVar99 >> 7,0);
      auVar147._28_4_ = (uint)bVar7 * auVar143._28_4_ | (uint)!bVar7 * auVar137._28_4_;
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar134,auVar137);
      local_8e0 = vmaxps_avx512vl(local_5a0,auVar137);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_a40 = vmulps_avx512vl(local_8e0,auVar37);
      vandps_avx512vl(auVar135,auVar137);
      uVar95 = vcmpps_avx512vl(local_a40,local_a40,1);
      uVar99 = uVar99 & uVar95;
      bVar91 = (byte)uVar99;
      if (bVar91 != 0) {
        uVar95 = vcmpps_avx512vl(auVar123,_DAT_01faff00,2);
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar135 = vblendmps_avx512vl(auVar123,auVar134);
        bVar92 = (byte)uVar95;
        uVar101 = (uint)(bVar92 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar92 & 1) * local_a40._0_4_;
        bVar7 = (bool)((byte)(uVar95 >> 1) & 1);
        uVar100 = (uint)bVar7 * auVar135._4_4_ | (uint)!bVar7 * local_a40._4_4_;
        bVar7 = (bool)((byte)(uVar95 >> 2) & 1);
        uVar164 = (uint)bVar7 * auVar135._8_4_ | (uint)!bVar7 * local_a40._8_4_;
        bVar7 = (bool)((byte)(uVar95 >> 3) & 1);
        uVar165 = (uint)bVar7 * auVar135._12_4_ | (uint)!bVar7 * local_a40._12_4_;
        bVar7 = (bool)((byte)(uVar95 >> 4) & 1);
        uVar166 = (uint)bVar7 * auVar135._16_4_ | (uint)!bVar7 * local_a40._16_4_;
        bVar7 = (bool)((byte)(uVar95 >> 5) & 1);
        uVar167 = (uint)bVar7 * auVar135._20_4_ | (uint)!bVar7 * local_a40._20_4_;
        bVar7 = (bool)((byte)(uVar95 >> 6) & 1);
        uVar168 = (uint)bVar7 * auVar135._24_4_ | (uint)!bVar7 * local_a40._24_4_;
        bVar7 = SUB81(uVar95 >> 7,0);
        uVar169 = (uint)bVar7 * auVar135._28_4_ | (uint)!bVar7 * local_a40._28_4_;
        auVar146._0_4_ = (bVar91 & 1) * uVar101 | !(bool)(bVar91 & 1) * auVar146._0_4_;
        bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar146._4_4_ = bVar7 * uVar100 | !bVar7 * auVar146._4_4_;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar146._8_4_ = bVar7 * uVar164 | !bVar7 * auVar146._8_4_;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar146._12_4_ = bVar7 * uVar165 | !bVar7 * auVar146._12_4_;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar146._16_4_ = bVar7 * uVar166 | !bVar7 * auVar146._16_4_;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar146._20_4_ = bVar7 * uVar167 | !bVar7 * auVar146._20_4_;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar146._24_4_ = bVar7 * uVar168 | !bVar7 * auVar146._24_4_;
        bVar7 = SUB81(uVar99 >> 7,0);
        auVar146._28_4_ = bVar7 * uVar169 | !bVar7 * auVar146._28_4_;
        auVar123 = vblendmps_avx512vl(auVar134,auVar123);
        bVar7 = (bool)((byte)(uVar95 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
        bVar14 = SUB81(uVar95 >> 7,0);
        auVar147._0_4_ =
             (uint)(bVar91 & 1) *
             ((uint)(bVar92 & 1) * auVar123._0_4_ | !(bool)(bVar92 & 1) * uVar101) |
             !(bool)(bVar91 & 1) * auVar147._0_4_;
        bVar8 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar147._4_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar123._4_4_ | !bVar7 * uVar100) |
             !bVar8 * auVar147._4_4_;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar147._8_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar123._8_4_ | !bVar9 * uVar164) |
             !bVar7 * auVar147._8_4_;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar147._12_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar123._12_4_ | !bVar10 * uVar165) |
             !bVar7 * auVar147._12_4_;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar147._16_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar123._16_4_ | !bVar11 * uVar166) |
             !bVar7 * auVar147._16_4_;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar147._20_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar123._20_4_ | !bVar12 * uVar167) |
             !bVar7 * auVar147._20_4_;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar147._24_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar123._24_4_ | !bVar13 * uVar168) |
             !bVar7 * auVar147._24_4_;
        bVar7 = SUB81(uVar99 >> 7,0);
        auVar147._28_4_ =
             (uint)bVar7 * ((uint)bVar14 * auVar123._28_4_ | !bVar14 * uVar169) |
             !bVar7 * auVar147._28_4_;
        bVar88 = (~bVar91 | bVar92) & bVar88;
      }
      if ((bVar88 & 0x7f) == 0) {
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar187 = ZEXT3264(auVar121);
        goto LAB_01d1acdb;
      }
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar132 = vxorps_avx512vl(auVar132,auVar123);
      auVar130 = vxorps_avx512vl(auVar130,auVar123);
      uVar101 = *(uint *)(ray + k * 4 + 0x200);
      auVar131 = vxorps_avx512vl(auVar131,auVar123);
      auVar102 = vsubss_avx512f(ZEXT416(uVar101),ZEXT416((uint)local_950._0_4_));
      auVar134 = vbroadcastss_avx512vl(auVar102);
      auVar134 = vminps_avx512vl(auVar134,auVar147);
      auVar87._4_4_ = fStack_65c;
      auVar87._0_4_ = local_660;
      auVar87._8_4_ = fStack_658;
      auVar87._12_4_ = fStack_654;
      auVar87._16_4_ = fStack_650;
      auVar87._20_4_ = fStack_64c;
      auVar87._24_4_ = fStack_648;
      auVar87._28_4_ = fStack_644;
      auVar135 = vmaxps_avx512vl(auVar87,auVar146);
      auVar137 = vmulps_avx512vl(auVar139,auVar54);
      auVar137 = vfmadd213ps_avx512vl(auVar138,auVar53,auVar137);
      auVar102 = vfmadd213ps_fma(auVar136,auVar52,auVar137);
      auVar136 = vmulps_avx512vl(_local_860,auVar54);
      auVar136 = vfmadd231ps_avx512vl(auVar136,local_840,auVar53);
      auVar111 = vfmadd231ps_fma(auVar136,local_820,auVar52);
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar111),auVar136);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar24 = vcmpps_avx512vl(auVar136,auVar137,1);
      auVar138 = vxorps_avx512vl(ZEXT1632(auVar102),auVar123);
      auVar139 = vrcp14ps_avx512vl(ZEXT1632(auVar111));
      auVar240 = ZEXT1632(auVar111);
      auVar143 = vxorps_avx512vl(auVar240,auVar123);
      auVar148 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar149 = vfnmadd213ps_avx512vl(auVar139,auVar240,auVar148);
      auVar102 = vfmadd132ps_fma(auVar149,auVar139,auVar139);
      fVar247 = auVar102._0_4_ * auVar138._0_4_;
      fVar253 = auVar102._4_4_ * auVar138._4_4_;
      auVar57._4_4_ = fVar253;
      auVar57._0_4_ = fVar247;
      fVar254 = auVar102._8_4_ * auVar138._8_4_;
      auVar57._8_4_ = fVar254;
      fVar255 = auVar102._12_4_ * auVar138._12_4_;
      auVar57._12_4_ = fVar255;
      fVar256 = auVar138._16_4_ * 0.0;
      auVar57._16_4_ = fVar256;
      fVar257 = auVar138._20_4_ * 0.0;
      auVar57._20_4_ = fVar257;
      fVar258 = auVar138._24_4_ * 0.0;
      auVar57._24_4_ = fVar258;
      auVar57._28_4_ = auVar138._28_4_;
      uVar25 = vcmpps_avx512vl(auVar240,auVar143,1);
      bVar91 = (byte)uVar24 | (byte)uVar25;
      auVar284._8_4_ = 0xff800000;
      auVar284._0_8_ = 0xff800000ff800000;
      auVar284._12_4_ = 0xff800000;
      auVar284._16_4_ = 0xff800000;
      auVar284._20_4_ = 0xff800000;
      auVar284._24_4_ = 0xff800000;
      auVar284._28_4_ = 0xff800000;
      auVar139 = vblendmps_avx512vl(auVar57,auVar284);
      auVar150._0_4_ = (uint)(bVar91 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar91 & 1) * -0x800000;
      bVar7 = (bool)(bVar91 >> 1 & 1);
      auVar150._4_4_ = (uint)bVar7 * auVar139._4_4_ | (uint)!bVar7 * -0x800000;
      bVar7 = (bool)(bVar91 >> 2 & 1);
      auVar150._8_4_ = (uint)bVar7 * auVar139._8_4_ | (uint)!bVar7 * -0x800000;
      bVar7 = (bool)(bVar91 >> 3 & 1);
      auVar150._12_4_ = (uint)bVar7 * auVar139._12_4_ | (uint)!bVar7 * -0x800000;
      bVar7 = (bool)(bVar91 >> 4 & 1);
      auVar150._16_4_ = (uint)bVar7 * auVar139._16_4_ | (uint)!bVar7 * -0x800000;
      bVar7 = (bool)(bVar91 >> 5 & 1);
      auVar150._20_4_ = (uint)bVar7 * auVar139._20_4_ | (uint)!bVar7 * -0x800000;
      bVar7 = (bool)(bVar91 >> 6 & 1);
      auVar150._24_4_ = (uint)bVar7 * auVar139._24_4_ | (uint)!bVar7 * -0x800000;
      auVar150._28_4_ =
           (uint)(bVar91 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar91 >> 7) * -0x800000;
      auVar139 = vmaxps_avx512vl(auVar135,auVar150);
      uVar25 = vcmpps_avx512vl(auVar240,auVar143,6);
      bVar91 = (byte)uVar24 | (byte)uVar25;
      auVar151._0_4_ = (uint)(bVar91 & 1) * 0x7f800000 | (uint)!(bool)(bVar91 & 1) * (int)fVar247;
      bVar7 = (bool)(bVar91 >> 1 & 1);
      auVar151._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar253;
      bVar7 = (bool)(bVar91 >> 2 & 1);
      auVar151._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar254;
      bVar7 = (bool)(bVar91 >> 3 & 1);
      auVar151._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar255;
      bVar7 = (bool)(bVar91 >> 4 & 1);
      auVar151._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar256;
      bVar7 = (bool)(bVar91 >> 5 & 1);
      auVar151._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar257;
      bVar7 = (bool)(bVar91 >> 6 & 1);
      auVar151._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar258;
      auVar151._28_4_ =
           (uint)(bVar91 >> 7) * 0x7f800000 | (uint)!(bool)(bVar91 >> 7) * auVar138._28_4_;
      auVar134 = vminps_avx512vl(auVar134,auVar151);
      auVar102 = vxorps_avx512vl(auVar135._0_16_,auVar135._0_16_);
      auVar125 = vsubps_avx512vl(ZEXT1632(auVar102),auVar125);
      auVar128 = vsubps_avx512vl(ZEXT1632(auVar102),auVar128);
      auVar135 = ZEXT1632(auVar102);
      auVar129 = vsubps_avx512vl(auVar135,auVar129);
      auVar129 = vmulps_avx512vl(auVar129,auVar132);
      auVar128 = vfmadd231ps_avx512vl(auVar129,auVar131,auVar128);
      auVar125 = vfmadd231ps_avx512vl(auVar128,auVar130,auVar125);
      auVar128 = vmulps_avx512vl(_local_860,auVar132);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_840,auVar131);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_820,auVar130);
      vandps_avx512vl(auVar128,auVar136);
      uVar24 = vcmpps_avx512vl(auVar128,auVar137,1);
      auVar125 = vxorps_avx512vl(auVar125,auVar123);
      auVar129 = vrcp14ps_avx512vl(auVar128);
      auVar123 = vxorps_avx512vl(auVar128,auVar123);
      auVar280 = ZEXT3264(auVar123);
      auVar130 = vfnmadd213ps_avx512vl(auVar129,auVar128,auVar148);
      auVar102 = vfmadd132ps_fma(auVar130,auVar129,auVar129);
      fVar247 = auVar102._0_4_ * auVar125._0_4_;
      fVar253 = auVar102._4_4_ * auVar125._4_4_;
      auVar58._4_4_ = fVar253;
      auVar58._0_4_ = fVar247;
      fVar254 = auVar102._8_4_ * auVar125._8_4_;
      auVar58._8_4_ = fVar254;
      fVar255 = auVar102._12_4_ * auVar125._12_4_;
      auVar58._12_4_ = fVar255;
      fVar256 = auVar125._16_4_ * 0.0;
      auVar58._16_4_ = fVar256;
      fVar257 = auVar125._20_4_ * 0.0;
      auVar58._20_4_ = fVar257;
      fVar258 = auVar125._24_4_ * 0.0;
      auVar58._24_4_ = fVar258;
      auVar58._28_4_ = auVar125._28_4_;
      uVar25 = vcmpps_avx512vl(auVar128,auVar123,1);
      bVar91 = (byte)uVar24 | (byte)uVar25;
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      auVar38._16_4_ = 0xff800000;
      auVar38._20_4_ = 0xff800000;
      auVar38._24_4_ = 0xff800000;
      auVar38._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar58,auVar38);
      auVar152._0_4_ =
           (uint)(bVar91 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar129._0_4_;
      bVar7 = (bool)(bVar91 >> 1 & 1);
      auVar152._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * auVar129._4_4_;
      bVar7 = (bool)(bVar91 >> 2 & 1);
      auVar152._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * auVar129._8_4_;
      bVar7 = (bool)(bVar91 >> 3 & 1);
      auVar152._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar129._12_4_;
      bVar7 = (bool)(bVar91 >> 4 & 1);
      auVar152._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * auVar129._16_4_;
      bVar7 = (bool)(bVar91 >> 5 & 1);
      auVar152._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * auVar129._20_4_;
      bVar7 = (bool)(bVar91 >> 6 & 1);
      auVar152._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * auVar129._24_4_;
      auVar152._28_4_ =
           (uint)(bVar91 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar91 >> 7) * auVar129._28_4_;
      auVar279 = ZEXT3264(auVar152);
      _local_900 = vmaxps_avx(auVar139,auVar152);
      auVar275 = ZEXT3264(_local_900);
      uVar25 = vcmpps_avx512vl(auVar128,auVar123,6);
      bVar91 = (byte)uVar24 | (byte)uVar25;
      auVar153._0_4_ = (uint)(bVar91 & 1) * 0x7f800000 | (uint)!(bool)(bVar91 & 1) * (int)fVar247;
      bVar7 = (bool)(bVar91 >> 1 & 1);
      auVar153._4_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar253;
      bVar7 = (bool)(bVar91 >> 2 & 1);
      auVar153._8_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar254;
      bVar7 = (bool)(bVar91 >> 3 & 1);
      auVar153._12_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar255;
      bVar7 = (bool)(bVar91 >> 4 & 1);
      auVar153._16_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar256;
      bVar7 = (bool)(bVar91 >> 5 & 1);
      auVar153._20_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar257;
      bVar7 = (bool)(bVar91 >> 6 & 1);
      auVar153._24_4_ = (uint)bVar7 * 0x7f800000 | (uint)!bVar7 * (int)fVar258;
      auVar153._28_4_ =
           (uint)(bVar91 >> 7) * 0x7f800000 | (uint)!(bool)(bVar91 >> 7) * auVar125._28_4_;
      local_6e0 = vminps_avx(auVar134,auVar153);
      uVar24 = vcmpps_avx512vl(_local_900,local_6e0,2);
      bVar88 = bVar88 & 0x7f & (byte)uVar24;
      if (bVar88 == 0) {
        auVar187 = ZEXT3264(auVar148);
        goto LAB_01d1acdb;
      }
      auVar123 = vmaxps_avx512vl(auVar135,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar145,auVar142,auVar133);
      auVar121 = vmulps_avx512vl(auVar127,auVar121);
      auVar125 = vfmadd213ps_avx512vl(local_aa0,auVar142,auVar133);
      auVar59._4_4_ = auVar127._4_4_ * auVar125._4_4_;
      auVar59._0_4_ = auVar127._0_4_ * auVar125._0_4_;
      auVar59._8_4_ = auVar127._8_4_ * auVar125._8_4_;
      auVar59._12_4_ = auVar127._12_4_ * auVar125._12_4_;
      auVar59._16_4_ = auVar127._16_4_ * auVar125._16_4_;
      auVar59._20_4_ = auVar127._20_4_ * auVar125._20_4_;
      auVar59._24_4_ = auVar127._24_4_ * auVar125._24_4_;
      auVar59._28_4_ = auVar152._28_4_;
      auVar121 = vminps_avx512vl(auVar121,auVar148);
      auVar125 = ZEXT832(0) << 0x20;
      auVar121 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
      auVar128 = vminps_avx512vl(auVar59,auVar148);
      auVar60._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar121._28_4_ + 7.0;
      auVar102 = vfmadd213ps_fma(auVar60,auVar178,auVar250);
      local_4e0 = ZEXT1632(auVar102);
      auVar121 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
      auVar61._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar121._28_4_ + 7.0;
      auVar102 = vfmadd213ps_fma(auVar61,auVar178,auVar250);
      local_500 = ZEXT1632(auVar102);
      auVar62._4_4_ = auVar123._4_4_ * auVar123._4_4_;
      auVar62._0_4_ = auVar123._0_4_ * auVar123._0_4_;
      auVar62._8_4_ = auVar123._8_4_ * auVar123._8_4_;
      auVar62._12_4_ = auVar123._12_4_ * auVar123._12_4_;
      auVar62._16_4_ = auVar123._16_4_ * auVar123._16_4_;
      auVar62._20_4_ = auVar123._20_4_ * auVar123._20_4_;
      auVar62._24_4_ = auVar123._24_4_ * auVar123._24_4_;
      auVar62._28_4_ = auVar123._28_4_;
      auVar121 = vsubps_avx(auVar141,auVar62);
      auVar63._4_4_ = auVar121._4_4_ * (float)local_880._4_4_;
      auVar63._0_4_ = auVar121._0_4_ * (float)local_880._0_4_;
      auVar63._8_4_ = auVar121._8_4_ * fStack_878;
      auVar63._12_4_ = auVar121._12_4_ * fStack_874;
      auVar63._16_4_ = auVar121._16_4_ * fStack_870;
      auVar63._20_4_ = auVar121._20_4_ * fStack_86c;
      auVar63._24_4_ = auVar121._24_4_ * fStack_868;
      auVar63._28_4_ = auVar123._28_4_;
      auVar123 = vsubps_avx(local_a80,auVar63);
      uVar24 = vcmpps_avx512vl(auVar123,ZEXT832(0) << 0x20,5);
      bVar91 = (byte)uVar24;
      auVar288 = ZEXT3264(local_b00);
      auVar289 = ZEXT3264(local_b20);
      if (bVar91 == 0) {
        bVar91 = 0;
        auVar124 = ZEXT832(0) << 0x20;
        auVar187 = ZEXT864(0) << 0x20;
        auVar123 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar128 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar279 = ZEXT864(0) << 0x20;
        auVar154._8_4_ = 0x7f800000;
        auVar154._0_8_ = 0x7f8000007f800000;
        auVar154._12_4_ = 0x7f800000;
        auVar154._16_4_ = 0x7f800000;
        auVar154._20_4_ = 0x7f800000;
        auVar154._24_4_ = 0x7f800000;
        auVar154._28_4_ = 0x7f800000;
        auVar155._8_4_ = 0xff800000;
        auVar155._0_8_ = 0xff800000ff800000;
        auVar155._12_4_ = 0xff800000;
        auVar155._16_4_ = 0xff800000;
        auVar155._20_4_ = 0xff800000;
        auVar155._24_4_ = 0xff800000;
        auVar155._28_4_ = 0xff800000;
      }
      else {
        uVar99 = vcmpps_avx512vl(auVar123,auVar135,5);
        auVar123 = vsqrtps_avx(auVar123);
        auVar125 = vfnmadd213ps_avx512vl(auVar144,local_8a0,auVar148);
        auVar129 = vfmadd132ps_avx512vl(auVar125,local_8a0,local_8a0);
        auVar125 = vsubps_avx(local_8c0,auVar123);
        auVar130 = vmulps_avx512vl(auVar125,auVar129);
        auVar123 = vsubps_avx512vl(auVar123,auVar140);
        auVar129 = vmulps_avx512vl(auVar123,auVar129);
        auVar123 = vfmadd213ps_avx512vl(auVar142,auVar130,auVar133);
        auVar64._4_4_ = auVar127._4_4_ * auVar123._4_4_;
        auVar64._0_4_ = auVar127._0_4_ * auVar123._0_4_;
        auVar64._8_4_ = auVar127._8_4_ * auVar123._8_4_;
        auVar64._12_4_ = auVar127._12_4_ * auVar123._12_4_;
        auVar64._16_4_ = auVar127._16_4_ * auVar123._16_4_;
        auVar64._20_4_ = auVar127._20_4_ * auVar123._20_4_;
        auVar64._24_4_ = auVar127._24_4_ * auVar123._24_4_;
        auVar64._28_4_ = auVar128._28_4_;
        auVar123 = vmulps_avx512vl(local_820,auVar130);
        auVar125 = vmulps_avx512vl(local_840,auVar130);
        auVar131 = vmulps_avx512vl(_local_860,auVar130);
        auVar128 = vfmadd213ps_avx512vl(auVar124,auVar64,auVar113);
        auVar123 = vsubps_avx512vl(auVar123,auVar128);
        auVar128 = vfmadd213ps_avx512vl(auVar122,auVar64,auVar126);
        auVar128 = vsubps_avx512vl(auVar125,auVar128);
        auVar102 = vfmadd213ps_fma(auVar64,auVar114,auVar112);
        auVar125 = vsubps_avx(auVar131,ZEXT1632(auVar102));
        auVar279 = ZEXT3264(auVar125);
        auVar125 = vfmadd213ps_avx512vl(auVar142,auVar129,auVar133);
        auVar127 = vmulps_avx512vl(auVar127,auVar125);
        auVar125 = vmulps_avx512vl(local_820,auVar129);
        auVar131 = vmulps_avx512vl(local_840,auVar129);
        auVar132 = vmulps_avx512vl(_local_860,auVar129);
        auVar102 = vfmadd213ps_fma(auVar124,auVar127,auVar113);
        auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar102));
        auVar102 = vfmadd213ps_fma(auVar122,auVar127,auVar126);
        auVar124 = vsubps_avx512vl(auVar131,ZEXT1632(auVar102));
        auVar102 = vfmadd213ps_fma(auVar114,auVar127,auVar112);
        auVar122 = vsubps_avx512vl(auVar132,ZEXT1632(auVar102));
        auVar187 = ZEXT3264(auVar122);
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar179._16_4_ = 0x7f800000;
        auVar179._20_4_ = 0x7f800000;
        auVar179._24_4_ = 0x7f800000;
        auVar179._28_4_ = 0x7f800000;
        auVar122 = vblendmps_avx512vl(auVar179,auVar130);
        bVar7 = (bool)((byte)uVar99 & 1);
        auVar154._0_4_ = (uint)bVar7 * auVar122._0_4_ | (uint)!bVar7 * auVar113._0_4_;
        bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar154._4_4_ = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * auVar113._4_4_;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar154._8_4_ = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * auVar113._8_4_;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar154._12_4_ = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * auVar113._12_4_;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar154._16_4_ = (uint)bVar7 * auVar122._16_4_ | (uint)!bVar7 * auVar113._16_4_;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar154._20_4_ = (uint)bVar7 * auVar122._20_4_ | (uint)!bVar7 * auVar113._20_4_;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar154._24_4_ = (uint)bVar7 * auVar122._24_4_ | (uint)!bVar7 * auVar113._24_4_;
        bVar7 = SUB81(uVar99 >> 7,0);
        auVar154._28_4_ = (uint)bVar7 * auVar122._28_4_ | (uint)!bVar7 * auVar113._28_4_;
        auVar180._8_4_ = 0xff800000;
        auVar180._0_8_ = 0xff800000ff800000;
        auVar180._12_4_ = 0xff800000;
        auVar180._16_4_ = 0xff800000;
        auVar180._20_4_ = 0xff800000;
        auVar180._24_4_ = 0xff800000;
        auVar180._28_4_ = 0xff800000;
        auVar122 = vblendmps_avx512vl(auVar180,auVar129);
        bVar7 = (bool)((byte)uVar99 & 1);
        auVar155._0_4_ = (uint)bVar7 * auVar122._0_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
        auVar155._16_4_ = (uint)bVar7 * auVar122._16_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
        auVar155._20_4_ = (uint)bVar7 * auVar122._20_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
        auVar155._24_4_ = (uint)bVar7 * auVar122._24_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = SUB81(uVar99 >> 7,0);
        auVar155._28_4_ = (uint)bVar7 * auVar122._28_4_ | (uint)!bVar7 * -0x800000;
        auVar39._8_4_ = 0x36000000;
        auVar39._0_8_ = 0x3600000036000000;
        auVar39._12_4_ = 0x36000000;
        auVar39._16_4_ = 0x36000000;
        auVar39._20_4_ = 0x36000000;
        auVar39._24_4_ = 0x36000000;
        auVar39._28_4_ = 0x36000000;
        auVar122 = vmulps_avx512vl(local_8e0,auVar39);
        uVar95 = vcmpps_avx512vl(auVar122,local_a40,0xe);
        uVar99 = uVar99 & uVar95;
        bVar92 = (byte)uVar99;
        if (bVar92 != 0) {
          uVar95 = vcmpps_avx512vl(auVar121,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar269._8_4_ = 0x7f800000;
          auVar269._0_8_ = 0x7f8000007f800000;
          auVar269._12_4_ = 0x7f800000;
          auVar269._16_4_ = 0x7f800000;
          auVar269._20_4_ = 0x7f800000;
          auVar269._24_4_ = 0x7f800000;
          auVar269._28_4_ = 0x7f800000;
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          auVar121 = vblendmps_avx512vl(auVar269,auVar274);
          bVar98 = (byte)uVar95;
          uVar100 = (uint)(bVar98 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar122._0_4_
          ;
          bVar7 = (bool)((byte)(uVar95 >> 1) & 1);
          uVar164 = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * auVar122._4_4_;
          bVar7 = (bool)((byte)(uVar95 >> 2) & 1);
          uVar165 = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * auVar122._8_4_;
          bVar7 = (bool)((byte)(uVar95 >> 3) & 1);
          uVar166 = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * auVar122._12_4_;
          bVar7 = (bool)((byte)(uVar95 >> 4) & 1);
          uVar167 = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * auVar122._16_4_;
          bVar7 = (bool)((byte)(uVar95 >> 5) & 1);
          uVar168 = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * auVar122._20_4_;
          bVar7 = (bool)((byte)(uVar95 >> 6) & 1);
          uVar169 = (uint)bVar7 * auVar121._24_4_ | (uint)!bVar7 * auVar122._24_4_;
          bVar7 = SUB81(uVar95 >> 7,0);
          uVar170 = (uint)bVar7 * auVar121._28_4_ | (uint)!bVar7 * auVar122._28_4_;
          auVar154._0_4_ = (bVar92 & 1) * uVar100 | !(bool)(bVar92 & 1) * auVar154._0_4_;
          bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar154._4_4_ = bVar7 * uVar164 | !bVar7 * auVar154._4_4_;
          bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar154._8_4_ = bVar7 * uVar165 | !bVar7 * auVar154._8_4_;
          bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar154._12_4_ = bVar7 * uVar166 | !bVar7 * auVar154._12_4_;
          bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar154._16_4_ = bVar7 * uVar167 | !bVar7 * auVar154._16_4_;
          bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar154._20_4_ = bVar7 * uVar168 | !bVar7 * auVar154._20_4_;
          bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar154._24_4_ = bVar7 * uVar169 | !bVar7 * auVar154._24_4_;
          bVar7 = SUB81(uVar99 >> 7,0);
          auVar154._28_4_ = bVar7 * uVar170 | !bVar7 * auVar154._28_4_;
          auVar121 = vblendmps_avx512vl(auVar274,auVar269);
          bVar7 = (bool)((byte)(uVar95 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar95 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar95 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar95 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar95 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar95 >> 6) & 1);
          bVar14 = SUB81(uVar95 >> 7,0);
          auVar155._0_4_ =
               (uint)(bVar92 & 1) *
               ((uint)(bVar98 & 1) * auVar121._0_4_ | !(bool)(bVar98 & 1) * uVar100) |
               !(bool)(bVar92 & 1) * auVar155._0_4_;
          bVar8 = (bool)((byte)(uVar99 >> 1) & 1);
          auVar155._4_4_ =
               (uint)bVar8 * ((uint)bVar7 * auVar121._4_4_ | !bVar7 * uVar164) |
               !bVar8 * auVar155._4_4_;
          bVar7 = (bool)((byte)(uVar99 >> 2) & 1);
          auVar155._8_4_ =
               (uint)bVar7 * ((uint)bVar9 * auVar121._8_4_ | !bVar9 * uVar165) |
               !bVar7 * auVar155._8_4_;
          bVar7 = (bool)((byte)(uVar99 >> 3) & 1);
          auVar155._12_4_ =
               (uint)bVar7 * ((uint)bVar10 * auVar121._12_4_ | !bVar10 * uVar166) |
               !bVar7 * auVar155._12_4_;
          bVar7 = (bool)((byte)(uVar99 >> 4) & 1);
          auVar155._16_4_ =
               (uint)bVar7 * ((uint)bVar11 * auVar121._16_4_ | !bVar11 * uVar167) |
               !bVar7 * auVar155._16_4_;
          bVar7 = (bool)((byte)(uVar99 >> 5) & 1);
          auVar155._20_4_ =
               (uint)bVar7 * ((uint)bVar12 * auVar121._20_4_ | !bVar12 * uVar168) |
               !bVar7 * auVar155._20_4_;
          bVar7 = (bool)((byte)(uVar99 >> 6) & 1);
          auVar155._24_4_ =
               (uint)bVar7 * ((uint)bVar13 * auVar121._24_4_ | !bVar13 * uVar169) |
               !bVar7 * auVar155._24_4_;
          bVar7 = SUB81(uVar99 >> 7,0);
          auVar155._28_4_ =
               (uint)bVar7 * ((uint)bVar14 * auVar121._28_4_ | !bVar14 * uVar170) |
               !bVar7 * auVar155._28_4_;
          bVar91 = (~bVar92 | bVar98) & bVar91;
        }
      }
      auVar280._0_4_ = (float)local_860._0_4_ * auVar187._0_4_;
      auVar280._4_4_ = (float)local_860._4_4_ * auVar187._4_4_;
      auVar280._8_4_ = fStack_858 * auVar187._8_4_;
      auVar280._12_4_ = fStack_854 * auVar187._12_4_;
      auVar280._16_4_ = fStack_850 * auVar187._16_4_;
      auVar280._20_4_ = fStack_84c * auVar187._20_4_;
      auVar280._28_36_ = auVar187._28_36_;
      auVar280._24_4_ = fStack_848 * auVar187._24_4_;
      auVar275 = ZEXT3264(local_840);
      auVar102 = vfmadd231ps_fma(auVar280._0_32_,local_840,auVar124);
      auVar270 = ZEXT3264(local_820);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_820,auVar125);
      auVar280 = ZEXT3264(_local_900);
      _local_540 = _local_900;
      local_520 = vminps_avx(local_6e0,auVar154);
      auVar261._8_4_ = 0x7fffffff;
      auVar261._0_8_ = 0x7fffffff7fffffff;
      auVar261._12_4_ = 0x7fffffff;
      auVar261._16_4_ = 0x7fffffff;
      auVar261._20_4_ = 0x7fffffff;
      auVar261._24_4_ = 0x7fffffff;
      auVar261._28_4_ = 0x7fffffff;
      auVar121 = vandps_avx(ZEXT1632(auVar102),auVar261);
      local_700 = vmaxps_avx(_local_900,auVar155);
      auVar182._8_4_ = 0x3e99999a;
      auVar182._0_8_ = 0x3e99999a3e99999a;
      auVar182._12_4_ = 0x3e99999a;
      auVar182._16_4_ = 0x3e99999a;
      auVar182._20_4_ = 0x3e99999a;
      auVar182._24_4_ = 0x3e99999a;
      auVar182._28_4_ = 0x3e99999a;
      uVar24 = vcmpps_avx512vl(auVar121,auVar182,1);
      local_780._0_2_ = (short)uVar24;
      uVar24 = vcmpps_avx512vl(_local_900,local_520,2);
      bVar92 = (byte)uVar24 & bVar88;
      uVar25 = vcmpps_avx512vl(local_700,local_6e0,2);
      auVar286 = ZEXT3264(local_ac0);
      auVar287 = ZEXT3264(local_ae0);
      if ((bVar88 & ((byte)uVar25 | (byte)uVar24)) == 0) {
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar187 = ZEXT3264(auVar121);
      }
      else {
        auVar65._4_4_ = (float)local_860._4_4_ * auVar279._4_4_;
        auVar65._0_4_ = (float)local_860._0_4_ * auVar279._0_4_;
        auVar65._8_4_ = fStack_858 * auVar279._8_4_;
        auVar65._12_4_ = fStack_854 * auVar279._12_4_;
        auVar65._16_4_ = fStack_850 * auVar279._16_4_;
        auVar65._20_4_ = fStack_84c * auVar279._20_4_;
        auVar65._24_4_ = fStack_848 * auVar279._24_4_;
        auVar65._28_4_ = 0x3e99999a;
        auVar102 = vfmadd213ps_fma(auVar128,local_840,auVar65);
        auVar102 = vfmadd213ps_fma(auVar123,local_820,ZEXT1632(auVar102));
        auVar121 = vandps_avx(ZEXT1632(auVar102),auVar261);
        uVar24 = vcmpps_avx512vl(auVar121,auVar182,1);
        bVar98 = (byte)uVar24 | ~bVar91;
        auVar183._8_4_ = 2;
        auVar183._0_8_ = 0x200000002;
        auVar183._12_4_ = 2;
        auVar183._16_4_ = 2;
        auVar183._20_4_ = 2;
        auVar183._24_4_ = 2;
        auVar183._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar121 = vpblendmd_avx512vl(auVar183,auVar40);
        local_6a0._0_4_ = (uint)(bVar98 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar98 & 1) * 2;
        bVar7 = (bool)(bVar98 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar98 >> 2 & 1);
        local_6a0._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar98 >> 3 & 1);
        local_6a0._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar98 >> 4 & 1);
        local_6a0._16_4_ = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar98 >> 5 & 1);
        local_6a0._20_4_ = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar98 >> 6 & 1);
        local_6a0._24_4_ = (uint)bVar7 * auVar121._24_4_ | (uint)!bVar7 * 2;
        local_6a0._28_4_ = (uint)(bVar98 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar98 >> 7) * 2;
        local_720 = vpbroadcastd_avx512vl();
        uVar24 = vpcmpd_avx512vl(local_720,local_6a0,5);
        bVar98 = (byte)uVar24 & bVar92;
        if (bVar98 == 0) {
          auVar185._4_4_ = uVar101;
          auVar185._0_4_ = uVar101;
          auVar185._8_4_ = uVar101;
          auVar185._12_4_ = uVar101;
          auVar185._16_4_ = uVar101;
          auVar185._20_4_ = uVar101;
          auVar185._24_4_ = uVar101;
          auVar185._28_4_ = uVar101;
          auVar121 = local_700;
        }
        else {
          local_6c0 = local_700;
          auVar111 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar102 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar103 = vminps_avx(auVar111,auVar1);
          auVar111 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar102,auVar111);
          auVar209._8_4_ = 0x7fffffff;
          auVar209._0_8_ = 0x7fffffff7fffffff;
          auVar209._12_4_ = 0x7fffffff;
          auVar102 = vandps_avx(auVar103,auVar209);
          auVar111 = vandps_avx(auVar1,auVar209);
          auVar102 = vmaxps_avx(auVar102,auVar111);
          auVar111 = vmovshdup_avx(auVar102);
          auVar111 = vmaxss_avx(auVar111,auVar102);
          auVar102 = vshufpd_avx(auVar102,auVar102,1);
          auVar102 = vmaxss_avx(auVar102,auVar111);
          fVar225 = auVar102._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          local_760 = (float)local_900._0_4_ + (float)local_a00._0_4_;
          fStack_75c = (float)local_900._4_4_ + (float)local_a00._4_4_;
          fStack_758 = fStack_8f8 + fStack_9f8;
          fStack_754 = fStack_8f4 + fStack_9f4;
          fStack_750 = fStack_8f0 + fStack_9f0;
          fStack_74c = fStack_8ec + fStack_9ec;
          fStack_748 = fStack_8e8 + fStack_9e8;
          fStack_744 = fStack_8e4 + fStack_9e4;
          do {
            auVar184._8_4_ = 0x7f800000;
            auVar184._0_8_ = 0x7f8000007f800000;
            auVar184._12_4_ = 0x7f800000;
            auVar184._16_4_ = 0x7f800000;
            auVar184._20_4_ = 0x7f800000;
            auVar184._24_4_ = 0x7f800000;
            auVar184._28_4_ = 0x7f800000;
            auVar121 = vblendmps_avx512vl(auVar184,_local_900);
            auVar157._0_4_ =
                 (uint)(bVar98 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar98 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar98 >> 1 & 1);
            auVar157._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar98 >> 2 & 1);
            auVar157._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar98 >> 3 & 1);
            auVar157._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar98 >> 4 & 1);
            auVar157._16_4_ = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar98 >> 5 & 1);
            auVar157._20_4_ = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar157._24_4_ =
                 (uint)(bVar98 >> 6) * auVar121._24_4_ | (uint)!(bool)(bVar98 >> 6) * 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar121 = vshufps_avx(auVar157,auVar157,0xb1);
            auVar121 = vminps_avx(auVar157,auVar121);
            auVar123 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar123);
            auVar123 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar123);
            uVar24 = vcmpps_avx512vl(auVar157,auVar121,0);
            bVar89 = (byte)uVar24 & bVar98;
            bVar90 = bVar98;
            if (bVar89 != 0) {
              bVar90 = bVar89;
            }
            iVar27 = 0;
            for (uVar101 = (uint)bVar90; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar101 = *(uint *)(local_4e0 + (uint)(iVar27 << 2));
            uVar100 = *(uint *)(local_540 + (uint)(iVar27 << 2));
            fVar241 = auVar22._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar241 = sqrtf((float)local_a20._0_4_);
            }
            auVar102 = vinsertps_avx(ZEXT416(uVar100),ZEXT416(uVar101),0x10);
            auVar187 = ZEXT1664(auVar102);
            lVar97 = 5;
            do {
              uVar188 = auVar187._0_4_;
              auVar172._4_4_ = uVar188;
              auVar172._0_4_ = uVar188;
              auVar172._8_4_ = uVar188;
              auVar172._12_4_ = uVar188;
              auVar102 = vfmadd132ps_fma(auVar172,ZEXT816(0) << 0x40,local_a10);
              auVar111 = vmovshdup_avx(auVar187._0_16_);
              fVar247 = auVar111._0_4_;
              fVar224 = 1.0 - fVar247;
              fVar242 = fVar247 * fVar247;
              auVar105 = SUB6416(ZEXT464(0x40400000),0);
              auVar104 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar103 = vfmadd213ss_fma(auVar105,auVar111,auVar104);
              auVar1 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar242),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar110 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar224),auVar104);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar224 * fVar224)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar243 = fVar224 * fVar224 * -fVar247 * 0.5;
              fVar244 = auVar1._0_4_ * 0.5;
              fVar245 = auVar110._0_4_ * 0.5;
              fVar246 = fVar247 * fVar247 * -fVar224 * 0.5;
              auVar226._0_4_ = fVar246 * (float)local_9e0._0_4_;
              auVar226._4_4_ = fVar246 * (float)local_9e0._4_4_;
              auVar226._8_4_ = fVar246 * fStack_9d8;
              auVar226._12_4_ = fVar246 * fStack_9d4;
              auVar248._4_4_ = fVar245;
              auVar248._0_4_ = fVar245;
              auVar248._8_4_ = fVar245;
              auVar248._12_4_ = fVar245;
              auVar1 = vfmadd132ps_fma(auVar248,auVar226,local_9a0._0_16_);
              auVar210._4_4_ = fVar244;
              auVar210._0_4_ = fVar244;
              auVar210._8_4_ = fVar244;
              auVar210._12_4_ = fVar244;
              auVar1 = vfmadd132ps_fma(auVar210,auVar1,local_9c0._0_16_);
              auVar227._4_4_ = fVar243;
              auVar227._0_4_ = fVar243;
              auVar227._8_4_ = fVar243;
              auVar227._12_4_ = fVar243;
              auVar1 = vfmadd132ps_fma(auVar227,auVar1,local_980._0_16_);
              auVar110 = vfmadd231ss_fma(auVar104,auVar111,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar110;
              auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar111,ZEXT416(0x40800000)
                                        );
              local_8c0._0_16_ = auVar110;
              auVar110 = vfmadd213ss_fma(auVar105,auVar111,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar110;
              _local_880 = auVar1;
              auVar1 = vsubps_avx(auVar102,auVar1);
              auVar102 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar243 = auVar102._0_4_;
              local_800 = auVar187;
              if (fVar243 < 0.0) {
                local_a80._0_4_ = auVar103._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar224);
                local_a40._0_4_ = fVar242;
                auVar275._0_4_ = sqrtf(fVar243);
                auVar275._4_60_ = extraout_var;
                auVar103 = ZEXT416((uint)local_a80._0_4_);
                auVar110 = auVar275._0_16_;
                auVar104 = local_aa0._0_16_;
              }
              else {
                auVar110 = vsqrtss_avx(auVar102,auVar102);
                local_a40._0_4_ = fVar242;
                auVar104 = ZEXT416((uint)fVar224);
              }
              fVar242 = auVar104._0_4_;
              auVar23 = vfnmadd231ss_fma(ZEXT416((uint)(fVar247 * (fVar242 + fVar242))),auVar104,
                                         auVar104);
              auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar247 + fVar247)),
                                         ZEXT416((uint)(fVar247 * fVar247 * 3.0)));
              auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar242 * -3.0)),
                                         ZEXT416((uint)(fVar242 + fVar242)),auVar104);
              auVar104 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 * -2.0)),auVar111,
                                         ZEXT416((uint)local_a40._0_4_));
              fVar242 = auVar23._0_4_ * 0.5;
              fVar244 = auVar103._0_4_ * 0.5;
              fVar245 = auVar105._0_4_ * 0.5;
              fVar246 = auVar104._0_4_ * 0.5;
              auVar228._0_4_ = fVar246 * (float)local_9e0._0_4_;
              auVar228._4_4_ = fVar246 * (float)local_9e0._4_4_;
              auVar228._8_4_ = fVar246 * fStack_9d8;
              auVar228._12_4_ = fVar246 * fStack_9d4;
              auVar211._4_4_ = fVar245;
              auVar211._0_4_ = fVar245;
              auVar211._8_4_ = fVar245;
              auVar211._12_4_ = fVar245;
              auVar103 = vfmadd132ps_fma(auVar211,auVar228,local_9a0._0_16_);
              auVar190._4_4_ = fVar244;
              auVar190._0_4_ = fVar244;
              auVar190._8_4_ = fVar244;
              auVar190._12_4_ = fVar244;
              auVar103 = vfmadd132ps_fma(auVar190,auVar103,local_9c0._0_16_);
              auVar282._4_4_ = fVar242;
              auVar282._0_4_ = fVar242;
              auVar282._8_4_ = fVar242;
              auVar282._12_4_ = fVar242;
              local_a80._0_16_ = vfmadd132ps_fma(auVar282,auVar103,local_980._0_16_);
              local_a40._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar66._12_4_ = 0;
              auVar66._0_12_ = ZEXT812(0);
              fVar242 = local_a40._0_4_;
              auVar103 = vrsqrt14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar242));
              fVar244 = auVar103._0_4_;
              auVar104 = vrcp14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar242));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar105 = vxorps_avx512vl(local_a40._0_16_,auVar28);
              auVar103 = vfnmadd213ss_fma(auVar104,local_a40._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_aa0._0_4_ = auVar110._0_4_;
              if (fVar242 < auVar105._0_4_) {
                fVar245 = sqrtf(fVar242);
                auVar110 = ZEXT416((uint)local_aa0._0_4_);
                auVar105 = local_a80._0_16_;
              }
              else {
                auVar105 = vsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar245 = auVar105._0_4_;
                auVar105 = local_a80._0_16_;
              }
              fVar242 = fVar244 * 1.5 + fVar242 * -0.5 * fVar244 * fVar244 * fVar244;
              auVar173._0_4_ = auVar105._0_4_ * fVar242;
              auVar173._4_4_ = auVar105._4_4_ * fVar242;
              auVar173._8_4_ = auVar105._8_4_ * fVar242;
              auVar173._12_4_ = auVar105._12_4_ * fVar242;
              auVar23 = vdpps_avx(auVar1,auVar173,0x7f);
              fVar224 = auVar110._0_4_;
              fVar244 = auVar23._0_4_;
              auVar174._0_4_ = fVar244 * fVar244;
              auVar174._4_4_ = auVar23._4_4_ * auVar23._4_4_;
              auVar174._8_4_ = auVar23._8_4_ * auVar23._8_4_;
              auVar174._12_4_ = auVar23._12_4_ * auVar23._12_4_;
              auVar106 = vsubps_avx512vl(auVar102,auVar174);
              fVar246 = auVar106._0_4_;
              auVar191._4_12_ = ZEXT812(0) << 0x20;
              auVar191._0_4_ = fVar246;
              auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              auVar108 = vmulss_avx512f(auVar106,ZEXT416(0xbf000000));
              if (fVar246 < 0.0) {
                local_930 = fVar242;
                fStack_92c = fVar242;
                fStack_928 = fVar242;
                fStack_924 = fVar242;
                local_920 = auVar107;
                fVar246 = sqrtf(fVar246);
                auVar108 = ZEXT416(auVar108._0_4_);
                auVar110 = ZEXT416((uint)local_aa0._0_4_);
                auVar106 = local_920;
                auVar105 = local_a80._0_16_;
                fVar242 = local_930;
                fVar247 = fStack_92c;
                fVar253 = fStack_928;
                fVar254 = fStack_924;
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar246 = auVar106._0_4_;
                auVar106 = auVar107;
                fVar247 = fVar242;
                fVar253 = fVar242;
                fVar254 = fVar242;
              }
              auVar279 = ZEXT1664(auVar1);
              auVar286 = ZEXT3264(local_ac0);
              auVar287 = ZEXT3264(local_ae0);
              auVar288 = ZEXT3264(local_b00);
              auVar289 = ZEXT3264(local_b20);
              auVar192._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar192._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar192._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar192._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar212._4_4_ = local_8c0._0_4_;
              auVar212._0_4_ = local_8c0._0_4_;
              auVar212._8_4_ = local_8c0._0_4_;
              auVar212._12_4_ = local_8c0._0_4_;
              auVar281 = vfmadd132ps_fma(auVar212,auVar192,local_9a0._0_16_);
              auVar193._4_4_ = local_8a0._0_4_;
              auVar193._0_4_ = local_8a0._0_4_;
              auVar193._8_4_ = local_8a0._0_4_;
              auVar193._12_4_ = local_8a0._0_4_;
              auVar281 = vfmadd132ps_fma(auVar193,auVar281,local_9c0._0_16_);
              auVar111 = vfmadd213ss_fma(auVar111,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000)
                                        );
              uVar188 = auVar111._0_4_;
              auVar213._4_4_ = uVar188;
              auVar213._0_4_ = uVar188;
              auVar213._8_4_ = uVar188;
              auVar213._12_4_ = uVar188;
              auVar111 = vfmadd132ps_fma(auVar213,auVar281,local_980._0_16_);
              auVar194._0_4_ = auVar111._0_4_ * (float)local_a40._0_4_;
              auVar194._4_4_ = auVar111._4_4_ * (float)local_a40._0_4_;
              auVar194._8_4_ = auVar111._8_4_ * (float)local_a40._0_4_;
              auVar194._12_4_ = auVar111._12_4_ * (float)local_a40._0_4_;
              auVar111 = vdpps_avx(auVar105,auVar111,0x7f);
              fVar255 = auVar111._0_4_;
              auVar214._0_4_ = auVar105._0_4_ * fVar255;
              auVar214._4_4_ = auVar105._4_4_ * fVar255;
              auVar214._8_4_ = auVar105._8_4_ * fVar255;
              auVar214._12_4_ = auVar105._12_4_ * fVar255;
              auVar111 = vsubps_avx(auVar194,auVar214);
              local_cb0 = auVar104._0_4_;
              local_cb0 = auVar103._0_4_ * local_cb0;
              auVar104 = vmaxss_avx(ZEXT416((uint)fVar225),
                                    ZEXT416((uint)(local_800._0_4_ * fVar241 * 1.9073486e-06)));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar161._16_48_ = local_800._16_48_;
              auVar109 = vxorps_avx512vl(auVar105,auVar29);
              auVar195._0_4_ = fVar242 * auVar111._0_4_ * local_cb0;
              auVar195._4_4_ = fVar247 * auVar111._4_4_ * local_cb0;
              auVar195._8_4_ = fVar253 * auVar111._8_4_ * local_cb0;
              auVar195._12_4_ = fVar254 * auVar111._12_4_ * local_cb0;
              auVar280 = ZEXT1664(auVar173);
              auVar111 = vdpps_avx(auVar109,auVar173,0x7f);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar225),auVar104);
              auVar103 = vdpps_avx(auVar1,auVar195,0x7f);
              auVar281 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 + 1.0)),
                                         ZEXT416((uint)(fVar225 / fVar245)),auVar110);
              fVar242 = auVar111._0_4_ + auVar103._0_4_;
              auVar111 = vdpps_avx(local_a10,auVar173,0x7f);
              auVar103 = vdpps_avx(auVar1,auVar109,0x7f);
              auVar110 = vmulss_avx512f(auVar108,auVar106);
              fVar245 = auVar107._0_4_ * 1.5 + auVar110._0_4_ * auVar106._0_4_ * auVar106._0_4_;
              auVar110 = vdpps_avx(auVar1,local_a10,0x7f);
              auVar107 = vfnmadd231ss_fma(auVar103,auVar23,ZEXT416((uint)fVar242));
              auVar110 = vfnmadd231ss_fma(auVar110,auVar23,auVar111);
              auVar103 = vpermilps_avx(_local_880,0xff);
              fVar246 = fVar246 - auVar103._0_4_;
              auVar106 = vshufps_avx(auVar105,auVar105,0xff);
              auVar103 = vfmsub213ss_fma(auVar107,ZEXT416((uint)fVar245),auVar106);
              auVar272._8_4_ = 0x80000000;
              auVar272._0_8_ = 0x8000000080000000;
              auVar272._12_4_ = 0x80000000;
              auVar275 = ZEXT1664(auVar272);
              auVar267._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar267._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar267._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar270 = ZEXT1664(auVar267);
              auVar110 = ZEXT416((uint)(auVar110._0_4_ * fVar245));
              auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar111._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar242),auVar110);
              auVar103 = vinsertps_avx(auVar267,auVar110,0x1c);
              auVar259._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar111._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar111._12_4_ ^ 0x80000000;
              auVar110 = vinsertps_avx(ZEXT416((uint)fVar242),auVar259,0x10);
              auVar229._0_4_ = auVar107._0_4_;
              auVar229._4_4_ = auVar229._0_4_;
              auVar229._8_4_ = auVar229._0_4_;
              auVar229._12_4_ = auVar229._0_4_;
              auVar111 = vdivps_avx(auVar103,auVar229);
              auVar103 = vdivps_avx(auVar110,auVar229);
              auVar230._0_4_ = fVar244 * auVar111._0_4_ + fVar246 * auVar103._0_4_;
              auVar230._4_4_ = fVar244 * auVar111._4_4_ + fVar246 * auVar103._4_4_;
              auVar230._8_4_ = fVar244 * auVar111._8_4_ + fVar246 * auVar103._8_4_;
              auVar230._12_4_ = fVar244 * auVar111._12_4_ + fVar246 * auVar103._12_4_;
              auVar111 = vsubps_avx(local_800._0_16_,auVar230);
              auVar187 = ZEXT1664(auVar111);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar23,auVar30);
              if (auVar103._0_4_ < auVar281._0_4_) {
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar104._0_4_)),
                                           local_940,ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar110 = vandps_avx512vl(ZEXT416((uint)fVar246),auVar31);
                if (auVar110._0_4_ < auVar103._0_4_) {
                  fVar241 = auVar111._0_4_ + (float)local_950._0_4_;
                  if ((fVar241 < fVar171) ||
                     (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar242 < fVar241)) break;
                  auVar111 = vmovshdup_avx(auVar111);
                  fVar244 = auVar111._0_4_;
                  if ((fVar244 < 0.0) || (1.0 < fVar244)) break;
                  auVar67._12_4_ = 0;
                  auVar67._0_12_ = ZEXT412(0);
                  auVar161._4_12_ = ZEXT412(0);
                  auVar161._0_4_ = fVar243;
                  auVar111 = vrsqrt14ss_avx512f(auVar67 << 0x20,auVar161._0_16_);
                  fVar243 = auVar111._0_4_;
                  auVar102 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar96].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar243 = fVar243 * 1.5 + auVar102._0_4_ * fVar243 * fVar243 * fVar243;
                  auVar231._0_4_ = auVar1._0_4_ * fVar243;
                  auVar231._4_4_ = auVar1._4_4_ * fVar243;
                  auVar231._8_4_ = auVar1._8_4_ * fVar243;
                  auVar231._12_4_ = auVar1._12_4_ * fVar243;
                  auVar110 = vfmadd213ps_fma(auVar106,auVar231,auVar105);
                  auVar102 = vshufps_avx(auVar231,auVar231,0xc9);
                  auVar111 = vshufps_avx(auVar105,auVar105,0xc9);
                  auVar232._0_4_ = auVar231._0_4_ * auVar111._0_4_;
                  auVar232._4_4_ = auVar231._4_4_ * auVar111._4_4_;
                  auVar232._8_4_ = auVar231._8_4_ * auVar111._8_4_;
                  auVar232._12_4_ = auVar231._12_4_ * auVar111._12_4_;
                  auVar103 = vfmsub231ps_fma(auVar232,auVar105,auVar102);
                  auVar102 = vshufps_avx(auVar103,auVar103,0xc9);
                  auVar111 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar103 = vshufps_avx(auVar103,auVar103,0xd2);
                  auVar196._0_4_ = auVar110._0_4_ * auVar103._0_4_;
                  auVar196._4_4_ = auVar110._4_4_ * auVar103._4_4_;
                  auVar196._8_4_ = auVar110._8_4_ * auVar103._8_4_;
                  auVar196._12_4_ = auVar110._12_4_ * auVar103._12_4_;
                  auVar102 = vfmsub231ps_fma(auVar196,auVar102,auVar111);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar241;
                    uVar188 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar188;
                    uVar188 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar188;
                    *(int *)(ray + k * 4 + 0x380) = auVar102._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar244;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar3;
                    *(uint *)(ray + k * 4 + 0x480) = uVar96;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar163,auVar187);
                  auVar187 = vpermps_avx512f(auVar163,ZEXT1664(auVar102));
                  auVar163 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar163,ZEXT1664(auVar102));
                  local_380 = vbroadcastss_avx512f(auVar102);
                  local_400[0] = (RTCHitN)auVar187[0];
                  local_400[1] = (RTCHitN)auVar187[1];
                  local_400[2] = (RTCHitN)auVar187[2];
                  local_400[3] = (RTCHitN)auVar187[3];
                  local_400[4] = (RTCHitN)auVar187[4];
                  local_400[5] = (RTCHitN)auVar187[5];
                  local_400[6] = (RTCHitN)auVar187[6];
                  local_400[7] = (RTCHitN)auVar187[7];
                  local_400[8] = (RTCHitN)auVar187[8];
                  local_400[9] = (RTCHitN)auVar187[9];
                  local_400[10] = (RTCHitN)auVar187[10];
                  local_400[0xb] = (RTCHitN)auVar187[0xb];
                  local_400[0xc] = (RTCHitN)auVar187[0xc];
                  local_400[0xd] = (RTCHitN)auVar187[0xd];
                  local_400[0xe] = (RTCHitN)auVar187[0xe];
                  local_400[0xf] = (RTCHitN)auVar187[0xf];
                  local_400[0x10] = (RTCHitN)auVar187[0x10];
                  local_400[0x11] = (RTCHitN)auVar187[0x11];
                  local_400[0x12] = (RTCHitN)auVar187[0x12];
                  local_400[0x13] = (RTCHitN)auVar187[0x13];
                  local_400[0x14] = (RTCHitN)auVar187[0x14];
                  local_400[0x15] = (RTCHitN)auVar187[0x15];
                  local_400[0x16] = (RTCHitN)auVar187[0x16];
                  local_400[0x17] = (RTCHitN)auVar187[0x17];
                  local_400[0x18] = (RTCHitN)auVar187[0x18];
                  local_400[0x19] = (RTCHitN)auVar187[0x19];
                  local_400[0x1a] = (RTCHitN)auVar187[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar187[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar187[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar187[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar187[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar187[0x1f];
                  local_400[0x20] = (RTCHitN)auVar187[0x20];
                  local_400[0x21] = (RTCHitN)auVar187[0x21];
                  local_400[0x22] = (RTCHitN)auVar187[0x22];
                  local_400[0x23] = (RTCHitN)auVar187[0x23];
                  local_400[0x24] = (RTCHitN)auVar187[0x24];
                  local_400[0x25] = (RTCHitN)auVar187[0x25];
                  local_400[0x26] = (RTCHitN)auVar187[0x26];
                  local_400[0x27] = (RTCHitN)auVar187[0x27];
                  local_400[0x28] = (RTCHitN)auVar187[0x28];
                  local_400[0x29] = (RTCHitN)auVar187[0x29];
                  local_400[0x2a] = (RTCHitN)auVar187[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar187[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar187[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar187[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar187[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar187[0x2f];
                  local_400[0x30] = (RTCHitN)auVar187[0x30];
                  local_400[0x31] = (RTCHitN)auVar187[0x31];
                  local_400[0x32] = (RTCHitN)auVar187[0x32];
                  local_400[0x33] = (RTCHitN)auVar187[0x33];
                  local_400[0x34] = (RTCHitN)auVar187[0x34];
                  local_400[0x35] = (RTCHitN)auVar187[0x35];
                  local_400[0x36] = (RTCHitN)auVar187[0x36];
                  local_400[0x37] = (RTCHitN)auVar187[0x37];
                  local_400[0x38] = (RTCHitN)auVar187[0x38];
                  local_400[0x39] = (RTCHitN)auVar187[0x39];
                  local_400[0x3a] = (RTCHitN)auVar187[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar187[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar187[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar187[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar187[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar187[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar187 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar187);
                  auVar121 = vpcmpeqd_avx2(auVar187._0_32_,auVar187._0_32_);
                  local_a48[3] = auVar121;
                  local_a48[2] = auVar121;
                  local_a48[1] = auVar121;
                  *local_a48 = auVar121;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar241;
                  auVar187 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar187);
                  local_b50.valid = (int *)local_7c0;
                  local_b50.geometryUserPtr = pGVar4->userPtr;
                  local_b50.context = context->user;
                  local_b50.hit = local_400;
                  local_b50.N = 0x10;
                  local_b50.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar270 = ZEXT1664(auVar267);
                    auVar275 = ZEXT1664(auVar272);
                    auVar279 = ZEXT1664(auVar1);
                    auVar280 = ZEXT1664(auVar173);
                    (*pGVar4->intersectionFilterN)(&local_b50);
                    auVar289 = ZEXT3264(local_b20);
                    auVar288 = ZEXT3264(local_b00);
                    auVar287 = ZEXT3264(local_ae0);
                    auVar286 = ZEXT3264(local_ac0);
                    auVar187 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar24 = vptestmd_avx512f(auVar187,auVar187);
                  if ((short)uVar24 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      auVar280 = ZEXT1664(auVar280._0_16_);
                      (*p_Var5)(&local_b50);
                      auVar289 = ZEXT3264(local_b20);
                      auVar288 = ZEXT3264(local_b00);
                      auVar287 = ZEXT3264(local_ae0);
                      auVar286 = ZEXT3264(local_ac0);
                      auVar187 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar99 = vptestmd_avx512f(auVar187,auVar187);
                    if ((short)uVar99 != 0) {
                      iVar70 = *(int *)(local_b50.hit + 4);
                      iVar71 = *(int *)(local_b50.hit + 8);
                      iVar72 = *(int *)(local_b50.hit + 0xc);
                      iVar73 = *(int *)(local_b50.hit + 0x10);
                      iVar74 = *(int *)(local_b50.hit + 0x14);
                      iVar75 = *(int *)(local_b50.hit + 0x18);
                      iVar76 = *(int *)(local_b50.hit + 0x1c);
                      iVar77 = *(int *)(local_b50.hit + 0x20);
                      iVar78 = *(int *)(local_b50.hit + 0x24);
                      iVar79 = *(int *)(local_b50.hit + 0x28);
                      iVar80 = *(int *)(local_b50.hit + 0x2c);
                      iVar81 = *(int *)(local_b50.hit + 0x30);
                      iVar82 = *(int *)(local_b50.hit + 0x34);
                      iVar83 = *(int *)(local_b50.hit + 0x38);
                      iVar84 = *(int *)(local_b50.hit + 0x3c);
                      bVar90 = (byte)uVar99;
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar89 = (byte)(uVar99 >> 8);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x300) =
                           (uint)(bVar90 & 1) * *(int *)local_b50.hit |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x300);
                      *(uint *)(local_b50.ray + 0x304) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x304);
                      *(uint *)(local_b50.ray + 0x308) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x308);
                      *(uint *)(local_b50.ray + 0x30c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x30c);
                      *(uint *)(local_b50.ray + 0x310) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x310);
                      *(uint *)(local_b50.ray + 0x314) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x314);
                      *(uint *)(local_b50.ray + 0x318) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x318);
                      *(uint *)(local_b50.ray + 0x31c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x31c);
                      *(uint *)(local_b50.ray + 800) =
                           (uint)(bVar89 & 1) * iVar77 |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_b50.ray + 800);
                      *(uint *)(local_b50.ray + 0x324) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x324);
                      *(uint *)(local_b50.ray + 0x328) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x328);
                      *(uint *)(local_b50.ray + 0x32c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x32c);
                      *(uint *)(local_b50.ray + 0x330) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x330);
                      *(uint *)(local_b50.ray + 0x334) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x334);
                      *(uint *)(local_b50.ray + 0x338) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x338);
                      *(uint *)(local_b50.ray + 0x33c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x33c);
                      iVar70 = *(int *)(local_b50.hit + 0x44);
                      iVar71 = *(int *)(local_b50.hit + 0x48);
                      iVar72 = *(int *)(local_b50.hit + 0x4c);
                      iVar73 = *(int *)(local_b50.hit + 0x50);
                      iVar74 = *(int *)(local_b50.hit + 0x54);
                      iVar75 = *(int *)(local_b50.hit + 0x58);
                      iVar76 = *(int *)(local_b50.hit + 0x5c);
                      iVar77 = *(int *)(local_b50.hit + 0x60);
                      iVar78 = *(int *)(local_b50.hit + 100);
                      iVar79 = *(int *)(local_b50.hit + 0x68);
                      iVar80 = *(int *)(local_b50.hit + 0x6c);
                      iVar81 = *(int *)(local_b50.hit + 0x70);
                      iVar82 = *(int *)(local_b50.hit + 0x74);
                      iVar83 = *(int *)(local_b50.hit + 0x78);
                      iVar84 = *(int *)(local_b50.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x340) =
                           (uint)(bVar90 & 1) * *(int *)(local_b50.hit + 0x40) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x340);
                      *(uint *)(local_b50.ray + 0x344) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x344);
                      *(uint *)(local_b50.ray + 0x348) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x348);
                      *(uint *)(local_b50.ray + 0x34c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x34c);
                      *(uint *)(local_b50.ray + 0x350) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x350);
                      *(uint *)(local_b50.ray + 0x354) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x354);
                      *(uint *)(local_b50.ray + 0x358) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x358);
                      *(uint *)(local_b50.ray + 0x35c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x35c);
                      *(uint *)(local_b50.ray + 0x360) =
                           (uint)(bVar89 & 1) * iVar77 |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_b50.ray + 0x360);
                      *(uint *)(local_b50.ray + 0x364) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x364);
                      *(uint *)(local_b50.ray + 0x368) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x368);
                      *(uint *)(local_b50.ray + 0x36c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x36c);
                      *(uint *)(local_b50.ray + 0x370) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x370);
                      *(uint *)(local_b50.ray + 0x374) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x374);
                      *(uint *)(local_b50.ray + 0x378) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x378);
                      *(uint *)(local_b50.ray + 0x37c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x37c);
                      iVar70 = *(int *)(local_b50.hit + 0x84);
                      iVar71 = *(int *)(local_b50.hit + 0x88);
                      iVar72 = *(int *)(local_b50.hit + 0x8c);
                      iVar73 = *(int *)(local_b50.hit + 0x90);
                      iVar74 = *(int *)(local_b50.hit + 0x94);
                      iVar75 = *(int *)(local_b50.hit + 0x98);
                      iVar76 = *(int *)(local_b50.hit + 0x9c);
                      iVar77 = *(int *)(local_b50.hit + 0xa0);
                      iVar78 = *(int *)(local_b50.hit + 0xa4);
                      iVar79 = *(int *)(local_b50.hit + 0xa8);
                      iVar80 = *(int *)(local_b50.hit + 0xac);
                      iVar81 = *(int *)(local_b50.hit + 0xb0);
                      iVar82 = *(int *)(local_b50.hit + 0xb4);
                      iVar83 = *(int *)(local_b50.hit + 0xb8);
                      iVar84 = *(int *)(local_b50.hit + 0xbc);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x380) =
                           (uint)(bVar90 & 1) * *(int *)(local_b50.hit + 0x80) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x380);
                      *(uint *)(local_b50.ray + 900) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 900);
                      *(uint *)(local_b50.ray + 0x388) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x388);
                      *(uint *)(local_b50.ray + 0x38c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x38c);
                      *(uint *)(local_b50.ray + 0x390) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x390);
                      *(uint *)(local_b50.ray + 0x394) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x394);
                      *(uint *)(local_b50.ray + 0x398) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x398);
                      *(uint *)(local_b50.ray + 0x39c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x39c);
                      *(uint *)(local_b50.ray + 0x3a0) =
                           (uint)(bVar89 & 1) * iVar77 |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_b50.ray + 0x3a0);
                      *(uint *)(local_b50.ray + 0x3a4) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3a4);
                      *(uint *)(local_b50.ray + 0x3a8) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x3a8);
                      *(uint *)(local_b50.ray + 0x3ac) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3ac);
                      *(uint *)(local_b50.ray + 0x3b0) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3b0);
                      *(uint *)(local_b50.ray + 0x3b4) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3b4);
                      *(uint *)(local_b50.ray + 0x3b8) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3b8);
                      *(uint *)(local_b50.ray + 0x3bc) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3bc);
                      iVar70 = *(int *)(local_b50.hit + 0xc4);
                      iVar71 = *(int *)(local_b50.hit + 200);
                      iVar72 = *(int *)(local_b50.hit + 0xcc);
                      iVar73 = *(int *)(local_b50.hit + 0xd0);
                      iVar74 = *(int *)(local_b50.hit + 0xd4);
                      iVar75 = *(int *)(local_b50.hit + 0xd8);
                      iVar76 = *(int *)(local_b50.hit + 0xdc);
                      iVar77 = *(int *)(local_b50.hit + 0xe0);
                      iVar78 = *(int *)(local_b50.hit + 0xe4);
                      iVar79 = *(int *)(local_b50.hit + 0xe8);
                      iVar80 = *(int *)(local_b50.hit + 0xec);
                      iVar81 = *(int *)(local_b50.hit + 0xf0);
                      iVar82 = *(int *)(local_b50.hit + 0xf4);
                      iVar83 = *(int *)(local_b50.hit + 0xf8);
                      iVar84 = *(int *)(local_b50.hit + 0xfc);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x3c0) =
                           (uint)(bVar90 & 1) * *(int *)(local_b50.hit + 0xc0) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x3c0);
                      *(uint *)(local_b50.ray + 0x3c4) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x3c4);
                      *(uint *)(local_b50.ray + 0x3c8) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x3c8);
                      *(uint *)(local_b50.ray + 0x3cc) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x3cc);
                      *(uint *)(local_b50.ray + 0x3d0) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x3d0);
                      *(uint *)(local_b50.ray + 0x3d4) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x3d4);
                      *(uint *)(local_b50.ray + 0x3d8) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x3d8);
                      *(uint *)(local_b50.ray + 0x3dc) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x3dc);
                      *(uint *)(local_b50.ray + 0x3e0) =
                           (uint)(bVar89 & 1) * iVar77 |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_b50.ray + 0x3e0);
                      *(uint *)(local_b50.ray + 0x3e4) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3e4);
                      *(uint *)(local_b50.ray + 1000) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 1000);
                      *(uint *)(local_b50.ray + 0x3ec) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3ec);
                      *(uint *)(local_b50.ray + 0x3f0) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3f0);
                      *(uint *)(local_b50.ray + 0x3f4) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3f4);
                      *(uint *)(local_b50.ray + 0x3f8) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3f8);
                      *(uint *)(local_b50.ray + 0x3fc) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3fc);
                      iVar70 = *(int *)(local_b50.hit + 0x104);
                      iVar71 = *(int *)(local_b50.hit + 0x108);
                      iVar72 = *(int *)(local_b50.hit + 0x10c);
                      iVar73 = *(int *)(local_b50.hit + 0x110);
                      iVar74 = *(int *)(local_b50.hit + 0x114);
                      iVar75 = *(int *)(local_b50.hit + 0x118);
                      iVar76 = *(int *)(local_b50.hit + 0x11c);
                      iVar77 = *(int *)(local_b50.hit + 0x120);
                      iVar78 = *(int *)(local_b50.hit + 0x124);
                      iVar79 = *(int *)(local_b50.hit + 0x128);
                      iVar80 = *(int *)(local_b50.hit + 300);
                      iVar81 = *(int *)(local_b50.hit + 0x130);
                      iVar82 = *(int *)(local_b50.hit + 0x134);
                      iVar83 = *(int *)(local_b50.hit + 0x138);
                      iVar84 = *(int *)(local_b50.hit + 0x13c);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x400) =
                           (uint)(bVar90 & 1) * *(int *)(local_b50.hit + 0x100) |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x400);
                      *(uint *)(local_b50.ray + 0x404) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x404);
                      *(uint *)(local_b50.ray + 0x408) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x408);
                      *(uint *)(local_b50.ray + 0x40c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x40c);
                      *(uint *)(local_b50.ray + 0x410) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x410);
                      *(uint *)(local_b50.ray + 0x414) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x414);
                      *(uint *)(local_b50.ray + 0x418) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x418);
                      *(uint *)(local_b50.ray + 0x41c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x41c);
                      *(uint *)(local_b50.ray + 0x420) =
                           (uint)(bVar89 & 1) * iVar77 |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_b50.ray + 0x420);
                      *(uint *)(local_b50.ray + 0x424) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x424);
                      *(uint *)(local_b50.ray + 0x428) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x428);
                      *(uint *)(local_b50.ray + 0x42c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x42c);
                      *(uint *)(local_b50.ray + 0x430) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x430);
                      *(uint *)(local_b50.ray + 0x434) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x434);
                      *(uint *)(local_b50.ray + 0x438) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x438);
                      *(uint *)(local_b50.ray + 0x43c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x43c);
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x140));
                      auVar187 = vmovdqu32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x180));
                      auVar187 = vmovdqu32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x1c0));
                      auVar187 = vmovdqa32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x200));
                      auVar187 = vmovdqa32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar187;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar242;
                  break;
                }
              }
              lVar97 = lVar97 + -1;
            } while (lVar97 != 0);
            uVar188 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar185._4_4_ = uVar188;
            auVar185._0_4_ = uVar188;
            auVar185._8_4_ = uVar188;
            auVar185._12_4_ = uVar188;
            auVar185._16_4_ = uVar188;
            auVar185._20_4_ = uVar188;
            auVar185._24_4_ = uVar188;
            auVar185._28_4_ = uVar188;
            auVar85._4_4_ = fStack_75c;
            auVar85._0_4_ = local_760;
            auVar85._8_4_ = fStack_758;
            auVar85._12_4_ = fStack_754;
            auVar85._16_4_ = fStack_750;
            auVar85._20_4_ = fStack_74c;
            auVar85._24_4_ = fStack_748;
            auVar85._28_4_ = fStack_744;
            uVar24 = vcmpps_avx512vl(auVar185,auVar85,0xd);
            bVar98 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar98 & (byte)uVar24;
          } while (bVar98 != 0);
          auVar121 = local_6c0;
        }
        bVar91 = local_780[0] | ~bVar91;
        auVar207._0_4_ = (float)local_a00._0_4_ + auVar121._0_4_;
        auVar207._4_4_ = (float)local_a00._4_4_ + auVar121._4_4_;
        auVar207._8_4_ = fStack_9f8 + auVar121._8_4_;
        auVar207._12_4_ = fStack_9f4 + auVar121._12_4_;
        auVar207._16_4_ = fStack_9f0 + auVar121._16_4_;
        auVar207._20_4_ = fStack_9ec + auVar121._20_4_;
        auVar207._24_4_ = fStack_9e8 + auVar121._24_4_;
        auVar207._28_4_ = fStack_9e4 + auVar121._28_4_;
        uVar24 = vcmpps_avx512vl(auVar207,auVar185,2);
        bVar88 = (byte)uVar25 & bVar88 & (byte)uVar24;
        auVar208._8_4_ = 2;
        auVar208._0_8_ = 0x200000002;
        auVar208._12_4_ = 2;
        auVar208._16_4_ = 2;
        auVar208._20_4_ = 2;
        auVar208._24_4_ = 2;
        auVar208._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar121 = vpblendmd_avx512vl(auVar208,auVar41);
        auVar158._0_4_ = (uint)(bVar91 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar91 & 1) * 2;
        bVar7 = (bool)(bVar91 >> 1 & 1);
        auVar158._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar91 >> 2 & 1);
        auVar158._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar91 >> 3 & 1);
        auVar158._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar91 >> 4 & 1);
        auVar158._16_4_ = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar91 >> 5 & 1);
        auVar158._20_4_ = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar91 >> 6 & 1);
        auVar158._24_4_ = (uint)bVar7 * auVar121._24_4_ | (uint)!bVar7 * 2;
        auVar158._28_4_ = (uint)(bVar91 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar91 >> 7) * 2;
        uVar24 = vpcmpd_avx512vl(local_720,auVar158,5);
        bVar91 = (byte)uVar24 & bVar88;
        fVar225 = (float)local_a00._0_4_;
        fVar241 = (float)local_a00._4_4_;
        fVar242 = fStack_9f8;
        fVar243 = fStack_9f4;
        fVar244 = fStack_9f0;
        fVar245 = fStack_9ec;
        fVar246 = fStack_9e8;
        fVar224 = fStack_9e4;
        if (bVar91 != 0) {
          auVar111 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar102 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar103 = vminps_avx(auVar111,auVar1);
          auVar111 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar102,auVar111);
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar102 = vandps_avx(auVar103,auVar215);
          auVar111 = vandps_avx(auVar1,auVar215);
          auVar102 = vmaxps_avx(auVar102,auVar111);
          auVar111 = vmovshdup_avx(auVar102);
          auVar111 = vmaxss_avx(auVar111,auVar102);
          auVar102 = vshufpd_avx(auVar102,auVar102,1);
          auVar102 = vmaxss_avx(auVar102,auVar111);
          fVar225 = auVar102._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          local_760 = (float)local_a00._0_4_ + local_700._0_4_;
          fStack_75c = (float)local_a00._4_4_ + local_700._4_4_;
          fStack_758 = fStack_9f8 + local_700._8_4_;
          fStack_754 = fStack_9f4 + local_700._12_4_;
          fStack_750 = fStack_9f0 + local_700._16_4_;
          fStack_74c = fStack_9ec + local_700._20_4_;
          fStack_748 = fStack_9e8 + local_700._24_4_;
          fStack_744 = fStack_9e4 + local_700._28_4_;
          _local_900 = local_700;
          local_780 = auVar158;
          do {
            auVar186._8_4_ = 0x7f800000;
            auVar186._0_8_ = 0x7f8000007f800000;
            auVar186._12_4_ = 0x7f800000;
            auVar186._16_4_ = 0x7f800000;
            auVar186._20_4_ = 0x7f800000;
            auVar186._24_4_ = 0x7f800000;
            auVar186._28_4_ = 0x7f800000;
            auVar121 = vblendmps_avx512vl(auVar186,_local_900);
            auVar159._0_4_ =
                 (uint)(bVar91 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar91 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar91 >> 1 & 1);
            auVar159._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar91 >> 2 & 1);
            auVar159._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar91 >> 3 & 1);
            auVar159._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar91 >> 4 & 1);
            auVar159._16_4_ = (uint)bVar7 * auVar121._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar91 >> 5 & 1);
            auVar159._20_4_ = (uint)bVar7 * auVar121._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar159._24_4_ =
                 (uint)(bVar91 >> 6) * auVar121._24_4_ | (uint)!(bool)(bVar91 >> 6) * 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar121 = vshufps_avx(auVar159,auVar159,0xb1);
            auVar121 = vminps_avx(auVar159,auVar121);
            auVar123 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar123);
            auVar123 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar123);
            uVar24 = vcmpps_avx512vl(auVar159,auVar121,0);
            bVar90 = (byte)uVar24 & bVar91;
            bVar98 = bVar91;
            if (bVar90 != 0) {
              bVar98 = bVar90;
            }
            iVar27 = 0;
            for (uVar101 = (uint)bVar98; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar101 = *(uint *)(local_500 + (uint)(iVar27 << 2));
            uVar100 = *(uint *)(local_6e0 + (uint)(iVar27 << 2));
            fVar241 = auVar21._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar241 = sqrtf((float)local_a20._0_4_);
            }
            auVar102 = vinsertps_avx(ZEXT416(uVar100),ZEXT416(uVar101),0x10);
            auVar187 = ZEXT1664(auVar102);
            lVar97 = 5;
            do {
              uVar188 = auVar187._0_4_;
              auVar175._4_4_ = uVar188;
              auVar175._0_4_ = uVar188;
              auVar175._8_4_ = uVar188;
              auVar175._12_4_ = uVar188;
              auVar102 = vfmadd132ps_fma(auVar175,ZEXT816(0) << 0x40,local_a10);
              auVar111 = vmovshdup_avx(auVar187._0_16_);
              fVar247 = auVar111._0_4_;
              fVar224 = 1.0 - fVar247;
              fVar242 = fVar247 * fVar247;
              auVar105 = SUB6416(ZEXT464(0x40400000),0);
              auVar104 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar103 = vfmadd213ss_fma(auVar105,auVar111,auVar104);
              auVar1 = vfmadd213ss_fma(auVar103,ZEXT416((uint)fVar242),
                                       SUB6416(ZEXT464(0x40000000),0));
              auVar110 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar224),auVar104);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar224 * fVar224)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar243 = fVar224 * fVar224 * -fVar247 * 0.5;
              fVar244 = auVar1._0_4_ * 0.5;
              fVar245 = auVar110._0_4_ * 0.5;
              fVar246 = fVar247 * fVar247 * -fVar224 * 0.5;
              auVar233._0_4_ = fVar246 * (float)local_9e0._0_4_;
              auVar233._4_4_ = fVar246 * (float)local_9e0._4_4_;
              auVar233._8_4_ = fVar246 * fStack_9d8;
              auVar233._12_4_ = fVar246 * fStack_9d4;
              auVar249._4_4_ = fVar245;
              auVar249._0_4_ = fVar245;
              auVar249._8_4_ = fVar245;
              auVar249._12_4_ = fVar245;
              auVar1 = vfmadd132ps_fma(auVar249,auVar233,local_9a0._0_16_);
              auVar216._4_4_ = fVar244;
              auVar216._0_4_ = fVar244;
              auVar216._8_4_ = fVar244;
              auVar216._12_4_ = fVar244;
              auVar1 = vfmadd132ps_fma(auVar216,auVar1,local_9c0._0_16_);
              auVar234._4_4_ = fVar243;
              auVar234._0_4_ = fVar243;
              auVar234._8_4_ = fVar243;
              auVar234._12_4_ = fVar243;
              auVar1 = vfmadd132ps_fma(auVar234,auVar1,local_980._0_16_);
              auVar110 = vfmadd231ss_fma(auVar104,auVar111,ZEXT416(0x41100000));
              local_8a0._0_16_ = auVar110;
              auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar111,ZEXT416(0x40800000)
                                        );
              local_8c0._0_16_ = auVar110;
              auVar110 = vfmadd213ss_fma(auVar105,auVar111,ZEXT416(0xbf800000));
              local_8e0._0_16_ = auVar110;
              _local_880 = auVar1;
              auVar1 = vsubps_avx(auVar102,auVar1);
              auVar102 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar243 = auVar102._0_4_;
              local_800 = auVar187;
              if (fVar243 < 0.0) {
                local_a80._0_4_ = auVar103._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar224);
                local_a40._0_4_ = fVar242;
                auVar279._0_4_ = sqrtf(fVar243);
                auVar279._4_60_ = extraout_var_00;
                auVar103 = ZEXT416((uint)local_a80._0_4_);
                auVar110 = auVar279._0_16_;
                auVar104 = local_aa0._0_16_;
              }
              else {
                auVar110 = vsqrtss_avx(auVar102,auVar102);
                local_a40._0_4_ = fVar242;
                auVar104 = ZEXT416((uint)fVar224);
              }
              fVar242 = auVar104._0_4_;
              auVar23 = vfnmadd231ss_fma(ZEXT416((uint)(fVar247 * (fVar242 + fVar242))),auVar104,
                                         auVar104);
              auVar103 = vfmadd213ss_fma(auVar103,ZEXT416((uint)(fVar247 + fVar247)),
                                         ZEXT416((uint)(fVar247 * fVar247 * 3.0)));
              auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar111,
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar242 * -3.0)),
                                         ZEXT416((uint)(fVar242 + fVar242)),auVar104);
              auVar104 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 * -2.0)),auVar111,
                                         ZEXT416((uint)local_a40._0_4_));
              fVar242 = auVar23._0_4_ * 0.5;
              fVar244 = auVar103._0_4_ * 0.5;
              fVar245 = auVar105._0_4_ * 0.5;
              fVar246 = auVar104._0_4_ * 0.5;
              auVar235._0_4_ = fVar246 * (float)local_9e0._0_4_;
              auVar235._4_4_ = fVar246 * (float)local_9e0._4_4_;
              auVar235._8_4_ = fVar246 * fStack_9d8;
              auVar235._12_4_ = fVar246 * fStack_9d4;
              auVar217._4_4_ = fVar245;
              auVar217._0_4_ = fVar245;
              auVar217._8_4_ = fVar245;
              auVar217._12_4_ = fVar245;
              auVar103 = vfmadd132ps_fma(auVar217,auVar235,local_9a0._0_16_);
              auVar197._4_4_ = fVar244;
              auVar197._0_4_ = fVar244;
              auVar197._8_4_ = fVar244;
              auVar197._12_4_ = fVar244;
              auVar103 = vfmadd132ps_fma(auVar197,auVar103,local_9c0._0_16_);
              auVar283._4_4_ = fVar242;
              auVar283._0_4_ = fVar242;
              auVar283._8_4_ = fVar242;
              auVar283._12_4_ = fVar242;
              local_a80._0_16_ = vfmadd132ps_fma(auVar283,auVar103,local_980._0_16_);
              local_a40._0_16_ = vdpps_avx(local_a80._0_16_,local_a80._0_16_,0x7f);
              auVar68._12_4_ = 0;
              auVar68._0_12_ = ZEXT812(0);
              fVar242 = local_a40._0_4_;
              auVar103 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar242));
              fVar244 = auVar103._0_4_;
              auVar104 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar242));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar105 = vxorps_avx512vl(local_a40._0_16_,auVar32);
              auVar103 = vfnmadd213ss_fma(auVar104,local_a40._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_aa0._0_4_ = auVar110._0_4_;
              if (fVar242 < auVar105._0_4_) {
                fVar245 = sqrtf(fVar242);
                auVar110 = ZEXT416((uint)local_aa0._0_4_);
                auVar105 = local_a80._0_16_;
              }
              else {
                auVar105 = vsqrtss_avx(local_a40._0_16_,local_a40._0_16_);
                fVar245 = auVar105._0_4_;
                auVar105 = local_a80._0_16_;
              }
              fVar242 = fVar244 * 1.5 + fVar242 * -0.5 * fVar244 * fVar244 * fVar244;
              auVar176._0_4_ = auVar105._0_4_ * fVar242;
              auVar176._4_4_ = auVar105._4_4_ * fVar242;
              auVar176._8_4_ = auVar105._8_4_ * fVar242;
              auVar176._12_4_ = auVar105._12_4_ * fVar242;
              auVar23 = vdpps_avx(auVar1,auVar176,0x7f);
              fVar224 = auVar110._0_4_;
              fVar244 = auVar23._0_4_;
              auVar177._0_4_ = fVar244 * fVar244;
              auVar177._4_4_ = auVar23._4_4_ * auVar23._4_4_;
              auVar177._8_4_ = auVar23._8_4_ * auVar23._8_4_;
              auVar177._12_4_ = auVar23._12_4_ * auVar23._12_4_;
              auVar106 = vsubps_avx512vl(auVar102,auVar177);
              fVar246 = auVar106._0_4_;
              auVar198._4_12_ = ZEXT812(0) << 0x20;
              auVar198._0_4_ = fVar246;
              auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
              auVar108 = vmulss_avx512f(auVar106,ZEXT416(0xbf000000));
              if (fVar246 < 0.0) {
                local_930 = fVar242;
                fStack_92c = fVar242;
                fStack_928 = fVar242;
                fStack_924 = fVar242;
                local_920 = auVar107;
                fVar246 = sqrtf(fVar246);
                auVar108 = ZEXT416(auVar108._0_4_);
                auVar110 = ZEXT416((uint)local_aa0._0_4_);
                auVar106 = local_920;
                auVar105 = local_a80._0_16_;
                fVar242 = local_930;
                fVar247 = fStack_92c;
                fVar253 = fStack_928;
                fVar254 = fStack_924;
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar246 = auVar106._0_4_;
                auVar106 = auVar107;
                fVar247 = fVar242;
                fVar253 = fVar242;
                fVar254 = fVar242;
              }
              auVar279 = ZEXT1664(auVar1);
              auVar286 = ZEXT3264(local_ac0);
              auVar287 = ZEXT3264(local_ae0);
              auVar288 = ZEXT3264(local_b00);
              auVar289 = ZEXT3264(local_b20);
              auVar199._0_4_ = (float)local_8e0._0_4_ * (float)local_9e0._0_4_;
              auVar199._4_4_ = (float)local_8e0._0_4_ * (float)local_9e0._4_4_;
              auVar199._8_4_ = (float)local_8e0._0_4_ * fStack_9d8;
              auVar199._12_4_ = (float)local_8e0._0_4_ * fStack_9d4;
              auVar218._4_4_ = local_8c0._0_4_;
              auVar218._0_4_ = local_8c0._0_4_;
              auVar218._8_4_ = local_8c0._0_4_;
              auVar218._12_4_ = local_8c0._0_4_;
              auVar281 = vfmadd132ps_fma(auVar218,auVar199,local_9a0._0_16_);
              auVar200._4_4_ = local_8a0._0_4_;
              auVar200._0_4_ = local_8a0._0_4_;
              auVar200._8_4_ = local_8a0._0_4_;
              auVar200._12_4_ = local_8a0._0_4_;
              auVar281 = vfmadd132ps_fma(auVar200,auVar281,local_9c0._0_16_);
              auVar111 = vfmadd213ss_fma(auVar111,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000)
                                        );
              uVar188 = auVar111._0_4_;
              auVar219._4_4_ = uVar188;
              auVar219._0_4_ = uVar188;
              auVar219._8_4_ = uVar188;
              auVar219._12_4_ = uVar188;
              auVar111 = vfmadd132ps_fma(auVar219,auVar281,local_980._0_16_);
              auVar201._0_4_ = auVar111._0_4_ * (float)local_a40._0_4_;
              auVar201._4_4_ = auVar111._4_4_ * (float)local_a40._0_4_;
              auVar201._8_4_ = auVar111._8_4_ * (float)local_a40._0_4_;
              auVar201._12_4_ = auVar111._12_4_ * (float)local_a40._0_4_;
              auVar111 = vdpps_avx(auVar105,auVar111,0x7f);
              fVar255 = auVar111._0_4_;
              auVar220._0_4_ = auVar105._0_4_ * fVar255;
              auVar220._4_4_ = auVar105._4_4_ * fVar255;
              auVar220._8_4_ = auVar105._8_4_ * fVar255;
              auVar220._12_4_ = auVar105._12_4_ * fVar255;
              auVar111 = vsubps_avx(auVar201,auVar220);
              local_cb0 = auVar104._0_4_;
              local_cb0 = auVar103._0_4_ * local_cb0;
              auVar104 = vmaxss_avx(ZEXT416((uint)fVar225),
                                    ZEXT416((uint)(local_800._0_4_ * fVar241 * 1.9073486e-06)));
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar162._16_48_ = local_800._16_48_;
              auVar109 = vxorps_avx512vl(auVar105,auVar33);
              auVar202._0_4_ = fVar242 * auVar111._0_4_ * local_cb0;
              auVar202._4_4_ = fVar247 * auVar111._4_4_ * local_cb0;
              auVar202._8_4_ = fVar253 * auVar111._8_4_ * local_cb0;
              auVar202._12_4_ = fVar254 * auVar111._12_4_ * local_cb0;
              auVar280 = ZEXT1664(auVar176);
              auVar111 = vdpps_avx(auVar109,auVar176,0x7f);
              auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar225),auVar104);
              auVar103 = vdpps_avx(auVar1,auVar202,0x7f);
              auVar281 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 + 1.0)),
                                         ZEXT416((uint)(fVar225 / fVar245)),auVar110);
              fVar242 = auVar111._0_4_ + auVar103._0_4_;
              auVar111 = vdpps_avx(local_a10,auVar176,0x7f);
              auVar103 = vdpps_avx(auVar1,auVar109,0x7f);
              auVar110 = vmulss_avx512f(auVar108,auVar106);
              fVar245 = auVar107._0_4_ * 1.5 + auVar110._0_4_ * auVar106._0_4_ * auVar106._0_4_;
              auVar110 = vdpps_avx(auVar1,local_a10,0x7f);
              auVar107 = vfnmadd231ss_fma(auVar103,auVar23,ZEXT416((uint)fVar242));
              auVar110 = vfnmadd231ss_fma(auVar110,auVar23,auVar111);
              auVar103 = vpermilps_avx(_local_880,0xff);
              fVar246 = fVar246 - auVar103._0_4_;
              auVar106 = vshufps_avx(auVar105,auVar105,0xff);
              auVar103 = vfmsub213ss_fma(auVar107,ZEXT416((uint)fVar245),auVar106);
              auVar273._8_4_ = 0x80000000;
              auVar273._0_8_ = 0x8000000080000000;
              auVar273._12_4_ = 0x80000000;
              auVar275 = ZEXT1664(auVar273);
              auVar268._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar268._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar268._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar270 = ZEXT1664(auVar268);
              auVar110 = ZEXT416((uint)(auVar110._0_4_ * fVar245));
              auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar111._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar242),auVar110);
              auVar103 = vinsertps_avx(auVar268,auVar110,0x1c);
              auVar260._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
              auVar260._8_4_ = auVar111._8_4_ ^ 0x80000000;
              auVar260._12_4_ = auVar111._12_4_ ^ 0x80000000;
              auVar110 = vinsertps_avx(ZEXT416((uint)fVar242),auVar260,0x10);
              auVar236._0_4_ = auVar107._0_4_;
              auVar236._4_4_ = auVar236._0_4_;
              auVar236._8_4_ = auVar236._0_4_;
              auVar236._12_4_ = auVar236._0_4_;
              auVar111 = vdivps_avx(auVar103,auVar236);
              auVar103 = vdivps_avx(auVar110,auVar236);
              auVar237._0_4_ = fVar244 * auVar111._0_4_ + fVar246 * auVar103._0_4_;
              auVar237._4_4_ = fVar244 * auVar111._4_4_ + fVar246 * auVar103._4_4_;
              auVar237._8_4_ = fVar244 * auVar111._8_4_ + fVar246 * auVar103._8_4_;
              auVar237._12_4_ = fVar244 * auVar111._12_4_ + fVar246 * auVar103._12_4_;
              auVar111 = vsubps_avx(local_800._0_16_,auVar237);
              auVar187 = ZEXT1664(auVar111);
              auVar34._8_4_ = 0x7fffffff;
              auVar34._0_8_ = 0x7fffffff7fffffff;
              auVar34._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar23,auVar34);
              if (auVar103._0_4_ < auVar281._0_4_) {
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar104._0_4_)),
                                           local_940,ZEXT416(0x36000000));
                auVar35._8_4_ = 0x7fffffff;
                auVar35._0_8_ = 0x7fffffff7fffffff;
                auVar35._12_4_ = 0x7fffffff;
                auVar110 = vandps_avx512vl(ZEXT416((uint)fVar246),auVar35);
                if (auVar110._0_4_ < auVar103._0_4_) {
                  fVar241 = auVar111._0_4_ + (float)local_950._0_4_;
                  if ((fVar241 < fVar171) ||
                     (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar242 < fVar241)) break;
                  auVar111 = vmovshdup_avx(auVar111);
                  fVar244 = auVar111._0_4_;
                  if ((fVar244 < 0.0) || (1.0 < fVar244)) break;
                  auVar69._12_4_ = 0;
                  auVar69._0_12_ = ZEXT412(0);
                  auVar162._4_12_ = ZEXT412(0);
                  auVar162._0_4_ = fVar243;
                  auVar111 = vrsqrt14ss_avx512f(auVar69 << 0x20,auVar162._0_16_);
                  fVar243 = auVar111._0_4_;
                  auVar102 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar96].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar243 = fVar243 * 1.5 + auVar102._0_4_ * fVar243 * fVar243 * fVar243;
                  auVar238._0_4_ = auVar1._0_4_ * fVar243;
                  auVar238._4_4_ = auVar1._4_4_ * fVar243;
                  auVar238._8_4_ = auVar1._8_4_ * fVar243;
                  auVar238._12_4_ = auVar1._12_4_ * fVar243;
                  auVar110 = vfmadd213ps_fma(auVar106,auVar238,auVar105);
                  auVar102 = vshufps_avx(auVar238,auVar238,0xc9);
                  auVar111 = vshufps_avx(auVar105,auVar105,0xc9);
                  auVar239._0_4_ = auVar238._0_4_ * auVar111._0_4_;
                  auVar239._4_4_ = auVar238._4_4_ * auVar111._4_4_;
                  auVar239._8_4_ = auVar238._8_4_ * auVar111._8_4_;
                  auVar239._12_4_ = auVar238._12_4_ * auVar111._12_4_;
                  auVar103 = vfmsub231ps_fma(auVar239,auVar105,auVar102);
                  auVar102 = vshufps_avx(auVar103,auVar103,0xc9);
                  auVar111 = vshufps_avx(auVar110,auVar110,0xc9);
                  auVar103 = vshufps_avx(auVar103,auVar103,0xd2);
                  auVar203._0_4_ = auVar110._0_4_ * auVar103._0_4_;
                  auVar203._4_4_ = auVar110._4_4_ * auVar103._4_4_;
                  auVar203._8_4_ = auVar110._8_4_ * auVar103._8_4_;
                  auVar203._12_4_ = auVar110._12_4_ * auVar103._12_4_;
                  auVar102 = vfmsub231ps_fma(auVar203,auVar102,auVar111);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar241;
                    uVar188 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar188;
                    uVar188 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar188;
                    *(int *)(ray + k * 4 + 0x380) = auVar102._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar244;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar3;
                    *(uint *)(ray + k * 4 + 0x480) = uVar96;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar163 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar163,auVar187);
                  auVar187 = vpermps_avx512f(auVar163,ZEXT1664(auVar102));
                  auVar163 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar163,ZEXT1664(auVar102));
                  local_380 = vbroadcastss_avx512f(auVar102);
                  local_400[0] = (RTCHitN)auVar187[0];
                  local_400[1] = (RTCHitN)auVar187[1];
                  local_400[2] = (RTCHitN)auVar187[2];
                  local_400[3] = (RTCHitN)auVar187[3];
                  local_400[4] = (RTCHitN)auVar187[4];
                  local_400[5] = (RTCHitN)auVar187[5];
                  local_400[6] = (RTCHitN)auVar187[6];
                  local_400[7] = (RTCHitN)auVar187[7];
                  local_400[8] = (RTCHitN)auVar187[8];
                  local_400[9] = (RTCHitN)auVar187[9];
                  local_400[10] = (RTCHitN)auVar187[10];
                  local_400[0xb] = (RTCHitN)auVar187[0xb];
                  local_400[0xc] = (RTCHitN)auVar187[0xc];
                  local_400[0xd] = (RTCHitN)auVar187[0xd];
                  local_400[0xe] = (RTCHitN)auVar187[0xe];
                  local_400[0xf] = (RTCHitN)auVar187[0xf];
                  local_400[0x10] = (RTCHitN)auVar187[0x10];
                  local_400[0x11] = (RTCHitN)auVar187[0x11];
                  local_400[0x12] = (RTCHitN)auVar187[0x12];
                  local_400[0x13] = (RTCHitN)auVar187[0x13];
                  local_400[0x14] = (RTCHitN)auVar187[0x14];
                  local_400[0x15] = (RTCHitN)auVar187[0x15];
                  local_400[0x16] = (RTCHitN)auVar187[0x16];
                  local_400[0x17] = (RTCHitN)auVar187[0x17];
                  local_400[0x18] = (RTCHitN)auVar187[0x18];
                  local_400[0x19] = (RTCHitN)auVar187[0x19];
                  local_400[0x1a] = (RTCHitN)auVar187[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar187[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar187[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar187[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar187[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar187[0x1f];
                  local_400[0x20] = (RTCHitN)auVar187[0x20];
                  local_400[0x21] = (RTCHitN)auVar187[0x21];
                  local_400[0x22] = (RTCHitN)auVar187[0x22];
                  local_400[0x23] = (RTCHitN)auVar187[0x23];
                  local_400[0x24] = (RTCHitN)auVar187[0x24];
                  local_400[0x25] = (RTCHitN)auVar187[0x25];
                  local_400[0x26] = (RTCHitN)auVar187[0x26];
                  local_400[0x27] = (RTCHitN)auVar187[0x27];
                  local_400[0x28] = (RTCHitN)auVar187[0x28];
                  local_400[0x29] = (RTCHitN)auVar187[0x29];
                  local_400[0x2a] = (RTCHitN)auVar187[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar187[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar187[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar187[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar187[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar187[0x2f];
                  local_400[0x30] = (RTCHitN)auVar187[0x30];
                  local_400[0x31] = (RTCHitN)auVar187[0x31];
                  local_400[0x32] = (RTCHitN)auVar187[0x32];
                  local_400[0x33] = (RTCHitN)auVar187[0x33];
                  local_400[0x34] = (RTCHitN)auVar187[0x34];
                  local_400[0x35] = (RTCHitN)auVar187[0x35];
                  local_400[0x36] = (RTCHitN)auVar187[0x36];
                  local_400[0x37] = (RTCHitN)auVar187[0x37];
                  local_400[0x38] = (RTCHitN)auVar187[0x38];
                  local_400[0x39] = (RTCHitN)auVar187[0x39];
                  local_400[0x3a] = (RTCHitN)auVar187[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar187[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar187[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar187[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar187[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar187[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar187 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar187);
                  auVar121 = vpcmpeqd_avx2(auVar187._0_32_,auVar187._0_32_);
                  local_a48[3] = auVar121;
                  local_a48[2] = auVar121;
                  local_a48[1] = auVar121;
                  *local_a48 = auVar121;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar6->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar6->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar241;
                  auVar187 = vmovdqa64_avx512f(local_4c0);
                  local_7c0 = vmovdqa64_avx512f(auVar187);
                  local_b50.valid = (int *)local_7c0;
                  local_b50.geometryUserPtr = pGVar4->userPtr;
                  local_b50.context = context->user;
                  local_b50.hit = local_400;
                  local_b50.N = 0x10;
                  local_b50.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar270 = ZEXT1664(auVar268);
                    auVar275 = ZEXT1664(auVar273);
                    auVar279 = ZEXT1664(auVar1);
                    auVar280 = ZEXT1664(auVar176);
                    (*pGVar4->intersectionFilterN)(&local_b50);
                    auVar289 = ZEXT3264(local_b20);
                    auVar288 = ZEXT3264(local_b00);
                    auVar287 = ZEXT3264(local_ae0);
                    auVar286 = ZEXT3264(local_ac0);
                    auVar187 = vmovdqa64_avx512f(local_7c0);
                  }
                  uVar24 = vptestmd_avx512f(auVar187,auVar187);
                  if ((short)uVar24 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      auVar280 = ZEXT1664(auVar280._0_16_);
                      (*p_Var5)(&local_b50);
                      auVar289 = ZEXT3264(local_b20);
                      auVar288 = ZEXT3264(local_b00);
                      auVar287 = ZEXT3264(local_ae0);
                      auVar286 = ZEXT3264(local_ac0);
                      auVar187 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar99 = vptestmd_avx512f(auVar187,auVar187);
                    if ((short)uVar99 != 0) {
                      iVar70 = *(int *)(local_b50.hit + 4);
                      iVar71 = *(int *)(local_b50.hit + 8);
                      iVar72 = *(int *)(local_b50.hit + 0xc);
                      iVar73 = *(int *)(local_b50.hit + 0x10);
                      iVar74 = *(int *)(local_b50.hit + 0x14);
                      iVar75 = *(int *)(local_b50.hit + 0x18);
                      iVar76 = *(int *)(local_b50.hit + 0x1c);
                      iVar77 = *(int *)(local_b50.hit + 0x20);
                      iVar78 = *(int *)(local_b50.hit + 0x24);
                      iVar79 = *(int *)(local_b50.hit + 0x28);
                      iVar80 = *(int *)(local_b50.hit + 0x2c);
                      iVar81 = *(int *)(local_b50.hit + 0x30);
                      iVar82 = *(int *)(local_b50.hit + 0x34);
                      iVar83 = *(int *)(local_b50.hit + 0x38);
                      iVar84 = *(int *)(local_b50.hit + 0x3c);
                      bVar98 = (byte)uVar99;
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar90 = (byte)(uVar99 >> 8);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x300) =
                           (uint)(bVar98 & 1) * *(int *)local_b50.hit |
                           (uint)!(bool)(bVar98 & 1) * *(int *)(local_b50.ray + 0x300);
                      *(uint *)(local_b50.ray + 0x304) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x304);
                      *(uint *)(local_b50.ray + 0x308) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x308);
                      *(uint *)(local_b50.ray + 0x30c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x30c);
                      *(uint *)(local_b50.ray + 0x310) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x310);
                      *(uint *)(local_b50.ray + 0x314) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x314);
                      *(uint *)(local_b50.ray + 0x318) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x318);
                      *(uint *)(local_b50.ray + 0x31c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x31c);
                      *(uint *)(local_b50.ray + 800) =
                           (uint)(bVar90 & 1) * iVar77 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 800);
                      *(uint *)(local_b50.ray + 0x324) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x324);
                      *(uint *)(local_b50.ray + 0x328) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x328);
                      *(uint *)(local_b50.ray + 0x32c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x32c);
                      *(uint *)(local_b50.ray + 0x330) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x330);
                      *(uint *)(local_b50.ray + 0x334) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x334);
                      *(uint *)(local_b50.ray + 0x338) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x338);
                      *(uint *)(local_b50.ray + 0x33c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x33c);
                      iVar70 = *(int *)(local_b50.hit + 0x44);
                      iVar71 = *(int *)(local_b50.hit + 0x48);
                      iVar72 = *(int *)(local_b50.hit + 0x4c);
                      iVar73 = *(int *)(local_b50.hit + 0x50);
                      iVar74 = *(int *)(local_b50.hit + 0x54);
                      iVar75 = *(int *)(local_b50.hit + 0x58);
                      iVar76 = *(int *)(local_b50.hit + 0x5c);
                      iVar77 = *(int *)(local_b50.hit + 0x60);
                      iVar78 = *(int *)(local_b50.hit + 100);
                      iVar79 = *(int *)(local_b50.hit + 0x68);
                      iVar80 = *(int *)(local_b50.hit + 0x6c);
                      iVar81 = *(int *)(local_b50.hit + 0x70);
                      iVar82 = *(int *)(local_b50.hit + 0x74);
                      iVar83 = *(int *)(local_b50.hit + 0x78);
                      iVar84 = *(int *)(local_b50.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x340) =
                           (uint)(bVar98 & 1) * *(int *)(local_b50.hit + 0x40) |
                           (uint)!(bool)(bVar98 & 1) * *(int *)(local_b50.ray + 0x340);
                      *(uint *)(local_b50.ray + 0x344) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x344);
                      *(uint *)(local_b50.ray + 0x348) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x348);
                      *(uint *)(local_b50.ray + 0x34c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x34c);
                      *(uint *)(local_b50.ray + 0x350) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x350);
                      *(uint *)(local_b50.ray + 0x354) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x354);
                      *(uint *)(local_b50.ray + 0x358) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x358);
                      *(uint *)(local_b50.ray + 0x35c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x35c);
                      *(uint *)(local_b50.ray + 0x360) =
                           (uint)(bVar90 & 1) * iVar77 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x360);
                      *(uint *)(local_b50.ray + 0x364) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x364);
                      *(uint *)(local_b50.ray + 0x368) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x368);
                      *(uint *)(local_b50.ray + 0x36c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x36c);
                      *(uint *)(local_b50.ray + 0x370) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x370);
                      *(uint *)(local_b50.ray + 0x374) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x374);
                      *(uint *)(local_b50.ray + 0x378) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x378);
                      *(uint *)(local_b50.ray + 0x37c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x37c);
                      iVar70 = *(int *)(local_b50.hit + 0x84);
                      iVar71 = *(int *)(local_b50.hit + 0x88);
                      iVar72 = *(int *)(local_b50.hit + 0x8c);
                      iVar73 = *(int *)(local_b50.hit + 0x90);
                      iVar74 = *(int *)(local_b50.hit + 0x94);
                      iVar75 = *(int *)(local_b50.hit + 0x98);
                      iVar76 = *(int *)(local_b50.hit + 0x9c);
                      iVar77 = *(int *)(local_b50.hit + 0xa0);
                      iVar78 = *(int *)(local_b50.hit + 0xa4);
                      iVar79 = *(int *)(local_b50.hit + 0xa8);
                      iVar80 = *(int *)(local_b50.hit + 0xac);
                      iVar81 = *(int *)(local_b50.hit + 0xb0);
                      iVar82 = *(int *)(local_b50.hit + 0xb4);
                      iVar83 = *(int *)(local_b50.hit + 0xb8);
                      iVar84 = *(int *)(local_b50.hit + 0xbc);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x380) =
                           (uint)(bVar98 & 1) * *(int *)(local_b50.hit + 0x80) |
                           (uint)!(bool)(bVar98 & 1) * *(int *)(local_b50.ray + 0x380);
                      *(uint *)(local_b50.ray + 900) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 900);
                      *(uint *)(local_b50.ray + 0x388) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x388);
                      *(uint *)(local_b50.ray + 0x38c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x38c);
                      *(uint *)(local_b50.ray + 0x390) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x390);
                      *(uint *)(local_b50.ray + 0x394) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x394);
                      *(uint *)(local_b50.ray + 0x398) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x398);
                      *(uint *)(local_b50.ray + 0x39c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x39c);
                      *(uint *)(local_b50.ray + 0x3a0) =
                           (uint)(bVar90 & 1) * iVar77 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x3a0);
                      *(uint *)(local_b50.ray + 0x3a4) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3a4);
                      *(uint *)(local_b50.ray + 0x3a8) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x3a8);
                      *(uint *)(local_b50.ray + 0x3ac) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3ac);
                      *(uint *)(local_b50.ray + 0x3b0) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3b0);
                      *(uint *)(local_b50.ray + 0x3b4) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3b4);
                      *(uint *)(local_b50.ray + 0x3b8) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3b8);
                      *(uint *)(local_b50.ray + 0x3bc) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3bc);
                      iVar70 = *(int *)(local_b50.hit + 0xc4);
                      iVar71 = *(int *)(local_b50.hit + 200);
                      iVar72 = *(int *)(local_b50.hit + 0xcc);
                      iVar73 = *(int *)(local_b50.hit + 0xd0);
                      iVar74 = *(int *)(local_b50.hit + 0xd4);
                      iVar75 = *(int *)(local_b50.hit + 0xd8);
                      iVar76 = *(int *)(local_b50.hit + 0xdc);
                      iVar77 = *(int *)(local_b50.hit + 0xe0);
                      iVar78 = *(int *)(local_b50.hit + 0xe4);
                      iVar79 = *(int *)(local_b50.hit + 0xe8);
                      iVar80 = *(int *)(local_b50.hit + 0xec);
                      iVar81 = *(int *)(local_b50.hit + 0xf0);
                      iVar82 = *(int *)(local_b50.hit + 0xf4);
                      iVar83 = *(int *)(local_b50.hit + 0xf8);
                      iVar84 = *(int *)(local_b50.hit + 0xfc);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x3c0) =
                           (uint)(bVar98 & 1) * *(int *)(local_b50.hit + 0xc0) |
                           (uint)!(bool)(bVar98 & 1) * *(int *)(local_b50.ray + 0x3c0);
                      *(uint *)(local_b50.ray + 0x3c4) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x3c4);
                      *(uint *)(local_b50.ray + 0x3c8) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x3c8);
                      *(uint *)(local_b50.ray + 0x3cc) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x3cc);
                      *(uint *)(local_b50.ray + 0x3d0) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x3d0);
                      *(uint *)(local_b50.ray + 0x3d4) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x3d4);
                      *(uint *)(local_b50.ray + 0x3d8) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x3d8);
                      *(uint *)(local_b50.ray + 0x3dc) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x3dc);
                      *(uint *)(local_b50.ray + 0x3e0) =
                           (uint)(bVar90 & 1) * iVar77 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x3e0);
                      *(uint *)(local_b50.ray + 0x3e4) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3e4);
                      *(uint *)(local_b50.ray + 1000) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 1000);
                      *(uint *)(local_b50.ray + 0x3ec) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3ec);
                      *(uint *)(local_b50.ray + 0x3f0) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3f0);
                      *(uint *)(local_b50.ray + 0x3f4) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3f4);
                      *(uint *)(local_b50.ray + 0x3f8) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3f8);
                      *(uint *)(local_b50.ray + 0x3fc) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3fc);
                      iVar70 = *(int *)(local_b50.hit + 0x104);
                      iVar71 = *(int *)(local_b50.hit + 0x108);
                      iVar72 = *(int *)(local_b50.hit + 0x10c);
                      iVar73 = *(int *)(local_b50.hit + 0x110);
                      iVar74 = *(int *)(local_b50.hit + 0x114);
                      iVar75 = *(int *)(local_b50.hit + 0x118);
                      iVar76 = *(int *)(local_b50.hit + 0x11c);
                      iVar77 = *(int *)(local_b50.hit + 0x120);
                      iVar78 = *(int *)(local_b50.hit + 0x124);
                      iVar79 = *(int *)(local_b50.hit + 0x128);
                      iVar80 = *(int *)(local_b50.hit + 300);
                      iVar81 = *(int *)(local_b50.hit + 0x130);
                      iVar82 = *(int *)(local_b50.hit + 0x134);
                      iVar83 = *(int *)(local_b50.hit + 0x138);
                      iVar84 = *(int *)(local_b50.hit + 0x13c);
                      bVar7 = (bool)((byte)(uVar99 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar99 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar99 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar99 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar99 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar99 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar99 >> 7) & 1);
                      bVar14 = (bool)((byte)(uVar99 >> 9) & 1);
                      bVar15 = (bool)((byte)(uVar99 >> 10) & 1);
                      bVar16 = (bool)((byte)(uVar99 >> 0xb) & 1);
                      bVar17 = (bool)((byte)(uVar99 >> 0xc) & 1);
                      bVar18 = (bool)((byte)(uVar99 >> 0xd) & 1);
                      bVar19 = (bool)((byte)(uVar99 >> 0xe) & 1);
                      bVar20 = SUB81(uVar99 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x400) =
                           (uint)(bVar98 & 1) * *(int *)(local_b50.hit + 0x100) |
                           (uint)!(bool)(bVar98 & 1) * *(int *)(local_b50.ray + 0x400);
                      *(uint *)(local_b50.ray + 0x404) =
                           (uint)bVar7 * iVar70 | (uint)!bVar7 * *(int *)(local_b50.ray + 0x404);
                      *(uint *)(local_b50.ray + 0x408) =
                           (uint)bVar8 * iVar71 | (uint)!bVar8 * *(int *)(local_b50.ray + 0x408);
                      *(uint *)(local_b50.ray + 0x40c) =
                           (uint)bVar9 * iVar72 | (uint)!bVar9 * *(int *)(local_b50.ray + 0x40c);
                      *(uint *)(local_b50.ray + 0x410) =
                           (uint)bVar10 * iVar73 | (uint)!bVar10 * *(int *)(local_b50.ray + 0x410);
                      *(uint *)(local_b50.ray + 0x414) =
                           (uint)bVar11 * iVar74 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x414);
                      *(uint *)(local_b50.ray + 0x418) =
                           (uint)bVar12 * iVar75 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x418);
                      *(uint *)(local_b50.ray + 0x41c) =
                           (uint)bVar13 * iVar76 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x41c);
                      *(uint *)(local_b50.ray + 0x420) =
                           (uint)(bVar90 & 1) * iVar77 |
                           (uint)!(bool)(bVar90 & 1) * *(int *)(local_b50.ray + 0x420);
                      *(uint *)(local_b50.ray + 0x424) =
                           (uint)bVar14 * iVar78 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x424);
                      *(uint *)(local_b50.ray + 0x428) =
                           (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x428);
                      *(uint *)(local_b50.ray + 0x42c) =
                           (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x42c);
                      *(uint *)(local_b50.ray + 0x430) =
                           (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x430);
                      *(uint *)(local_b50.ray + 0x434) =
                           (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x434);
                      *(uint *)(local_b50.ray + 0x438) =
                           (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x438);
                      *(uint *)(local_b50.ray + 0x43c) =
                           (uint)bVar20 * iVar84 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x43c);
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x140));
                      auVar187 = vmovdqu32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x180));
                      auVar187 = vmovdqu32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x1c0));
                      auVar187 = vmovdqa32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar187;
                      auVar187 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x200));
                      auVar187 = vmovdqa32_avx512f(auVar187);
                      *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar187;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar242;
                  break;
                }
              }
              lVar97 = lVar97 + -1;
            } while (lVar97 != 0);
            uVar188 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar185._4_4_ = uVar188;
            auVar185._0_4_ = uVar188;
            auVar185._8_4_ = uVar188;
            auVar185._12_4_ = uVar188;
            auVar185._16_4_ = uVar188;
            auVar185._20_4_ = uVar188;
            auVar185._24_4_ = uVar188;
            auVar185._28_4_ = uVar188;
            auVar86._4_4_ = fStack_75c;
            auVar86._0_4_ = local_760;
            auVar86._8_4_ = fStack_758;
            auVar86._12_4_ = fStack_754;
            auVar86._16_4_ = fStack_750;
            auVar86._20_4_ = fStack_74c;
            auVar86._24_4_ = fStack_748;
            auVar86._28_4_ = fStack_744;
            uVar24 = vcmpps_avx512vl(auVar185,auVar86,0xd);
            bVar91 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar91 & (byte)uVar24;
          } while (bVar91 != 0);
          auVar158 = local_780;
          fVar225 = (float)local_a00._0_4_;
          fVar241 = (float)local_a00._4_4_;
          fVar242 = fStack_9f8;
          fVar243 = fStack_9f4;
          fVar244 = fStack_9f0;
          fVar245 = fStack_9ec;
          fVar246 = fStack_9e8;
          fVar224 = fStack_9e4;
        }
        uVar25 = vpcmpgtd_avx512vl(auVar158,local_720);
        uVar26 = vpcmpd_avx512vl(local_720,local_6a0,1);
        auVar222._0_4_ = fVar225 + (float)local_540._0_4_;
        auVar222._4_4_ = fVar241 + (float)local_540._4_4_;
        auVar222._8_4_ = fVar242 + fStack_538;
        auVar222._12_4_ = fVar243 + fStack_534;
        auVar222._16_4_ = fVar244 + fStack_530;
        auVar222._20_4_ = fVar245 + fStack_52c;
        auVar222._24_4_ = fVar246 + fStack_528;
        auVar222._28_4_ = fVar224 + fStack_524;
        uVar24 = vcmpps_avx512vl(auVar222,auVar185,2);
        bVar92 = bVar92 & (byte)uVar26 & (byte)uVar24;
        auVar223._0_4_ = fVar225 + local_700._0_4_;
        auVar223._4_4_ = fVar241 + local_700._4_4_;
        auVar223._8_4_ = fVar242 + local_700._8_4_;
        auVar223._12_4_ = fVar243 + local_700._12_4_;
        auVar223._16_4_ = fVar244 + local_700._16_4_;
        auVar223._20_4_ = fVar245 + local_700._20_4_;
        auVar223._24_4_ = fVar246 + local_700._24_4_;
        auVar223._28_4_ = fVar224 + local_700._28_4_;
        uVar24 = vcmpps_avx512vl(auVar223,auVar185,2);
        bVar88 = bVar88 & (byte)uVar25 & (byte)uVar24 | bVar92;
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar187 = ZEXT3264(auVar121);
        prim = local_910;
        if (bVar88 != 0) {
          abStack_1a0[uVar93 * 0x60] = bVar88;
          auVar160._0_4_ =
               (uint)(bVar92 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar92 & 1) * (int)local_700._0_4_;
          bVar7 = (bool)(bVar92 >> 1 & 1);
          auVar160._4_4_ = (uint)bVar7 * local_540._4_4_ | (uint)!bVar7 * (int)local_700._4_4_;
          bVar7 = (bool)(bVar92 >> 2 & 1);
          auVar160._8_4_ = (uint)bVar7 * (int)fStack_538 | (uint)!bVar7 * (int)local_700._8_4_;
          bVar7 = (bool)(bVar92 >> 3 & 1);
          auVar160._12_4_ = (uint)bVar7 * (int)fStack_534 | (uint)!bVar7 * (int)local_700._12_4_;
          bVar7 = (bool)(bVar92 >> 4 & 1);
          auVar160._16_4_ = (uint)bVar7 * (int)fStack_530 | (uint)!bVar7 * (int)local_700._16_4_;
          bVar7 = (bool)(bVar92 >> 5 & 1);
          auVar160._20_4_ = (uint)bVar7 * (int)fStack_52c | (uint)!bVar7 * (int)local_700._20_4_;
          auVar160._24_4_ =
               (uint)(bVar92 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar92 >> 6) * (int)local_700._24_4_;
          auVar160._28_4_ = local_700._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar160;
          uVar99 = vmovlps_avx(local_730);
          (&uStack_160)[uVar93 * 0xc] = uVar99;
          aiStack_158[uVar93 * 0x18] = iVar94 + 1;
          uVar93 = (ulong)((int)uVar93 + 1);
        }
      }
    }
    do {
      uVar101 = (uint)uVar93;
      uVar93 = (ulong)(uVar101 - 1);
      if (uVar101 == 0) {
        uVar188 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar188;
        auVar43._0_4_ = uVar188;
        auVar43._8_4_ = uVar188;
        auVar43._12_4_ = uVar188;
        auVar43._16_4_ = uVar188;
        auVar43._20_4_ = uVar188;
        auVar43._24_4_ = uVar188;
        auVar43._28_4_ = uVar188;
        uVar24 = vcmpps_avx512vl(local_680,auVar43,2);
        uVar96 = (uint)local_908 & (uint)uVar24;
        local_908 = (ulong)uVar96;
        if (uVar96 == 0) {
          return;
        }
        goto LAB_01d19fa4;
      }
      lVar97 = uVar93 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_180 + lVar97);
      auVar205._0_4_ = fVar225 + auVar121._0_4_;
      auVar205._4_4_ = fVar241 + auVar121._4_4_;
      auVar205._8_4_ = fVar242 + auVar121._8_4_;
      auVar205._12_4_ = fVar243 + auVar121._12_4_;
      auVar205._16_4_ = fVar244 + auVar121._16_4_;
      auVar205._20_4_ = fVar245 + auVar121._20_4_;
      auVar205._24_4_ = fVar246 + auVar121._24_4_;
      auVar205._28_4_ = fVar224 + auVar121._28_4_;
      uVar188 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar188;
      auVar42._0_4_ = uVar188;
      auVar42._8_4_ = uVar188;
      auVar42._12_4_ = uVar188;
      auVar42._16_4_ = uVar188;
      auVar42._20_4_ = uVar188;
      auVar42._24_4_ = uVar188;
      auVar42._28_4_ = uVar188;
      uVar24 = vcmpps_avx512vl(auVar205,auVar42,2);
      uVar100 = (uint)uVar24 & (uint)abStack_1a0[lVar97];
    } while (uVar100 == 0);
    uVar99 = (&uStack_160)[uVar93 * 0xc];
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar99;
    auVar221._8_4_ = 0x7f800000;
    auVar221._0_8_ = 0x7f8000007f800000;
    auVar221._12_4_ = 0x7f800000;
    auVar221._16_4_ = 0x7f800000;
    auVar221._20_4_ = 0x7f800000;
    auVar221._24_4_ = 0x7f800000;
    auVar221._28_4_ = 0x7f800000;
    auVar123 = vblendmps_avx512vl(auVar221,auVar121);
    bVar88 = (byte)uVar100;
    auVar156._0_4_ =
         (uint)(bVar88 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)auVar121._0_4_;
    bVar7 = (bool)((byte)(uVar100 >> 1) & 1);
    auVar156._4_4_ = (uint)bVar7 * auVar123._4_4_ | (uint)!bVar7 * (int)auVar121._4_4_;
    bVar7 = (bool)((byte)(uVar100 >> 2) & 1);
    auVar156._8_4_ = (uint)bVar7 * auVar123._8_4_ | (uint)!bVar7 * (int)auVar121._8_4_;
    bVar7 = (bool)((byte)(uVar100 >> 3) & 1);
    auVar156._12_4_ = (uint)bVar7 * auVar123._12_4_ | (uint)!bVar7 * (int)auVar121._12_4_;
    bVar7 = (bool)((byte)(uVar100 >> 4) & 1);
    auVar156._16_4_ = (uint)bVar7 * auVar123._16_4_ | (uint)!bVar7 * (int)auVar121._16_4_;
    bVar7 = (bool)((byte)(uVar100 >> 5) & 1);
    auVar156._20_4_ = (uint)bVar7 * auVar123._20_4_ | (uint)!bVar7 * (int)auVar121._20_4_;
    bVar7 = (bool)((byte)(uVar100 >> 6) & 1);
    auVar156._24_4_ = (uint)bVar7 * auVar123._24_4_ | (uint)!bVar7 * (int)auVar121._24_4_;
    auVar156._28_4_ =
         (uVar100 >> 7) * auVar123._28_4_ | (uint)!SUB41(uVar100 >> 7,0) * (int)auVar121._28_4_;
    auVar121 = vshufps_avx(auVar156,auVar156,0xb1);
    auVar121 = vminps_avx(auVar156,auVar121);
    auVar123 = vshufpd_avx(auVar121,auVar121,5);
    auVar121 = vminps_avx(auVar121,auVar123);
    auVar123 = vpermpd_avx2(auVar121,0x4e);
    auVar121 = vminps_avx(auVar121,auVar123);
    uVar24 = vcmpps_avx512vl(auVar156,auVar121,0);
    bVar91 = (byte)uVar24 & bVar88;
    if (bVar91 != 0) {
      uVar100 = (uint)bVar91;
    }
    uVar164 = 0;
    for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
      uVar164 = uVar164 + 1;
    }
    iVar94 = aiStack_158[uVar93 * 0x18];
    bVar88 = ~('\x01' << ((byte)uVar164 & 0x1f)) & bVar88;
    abStack_1a0[lVar97] = bVar88;
    if (bVar88 == 0) {
      uVar101 = uVar101 - 1;
    }
    uVar188 = (undefined4)uVar99;
    auVar181._4_4_ = uVar188;
    auVar181._0_4_ = uVar188;
    auVar181._8_4_ = uVar188;
    auVar181._12_4_ = uVar188;
    auVar181._16_4_ = uVar188;
    auVar181._20_4_ = uVar188;
    auVar181._24_4_ = uVar188;
    auVar181._28_4_ = uVar188;
    auVar102 = vmovshdup_avx(auVar189);
    auVar102 = vsubps_avx(auVar102,auVar189);
    auVar206._0_4_ = auVar102._0_4_;
    auVar206._4_4_ = auVar206._0_4_;
    auVar206._8_4_ = auVar206._0_4_;
    auVar206._12_4_ = auVar206._0_4_;
    auVar206._16_4_ = auVar206._0_4_;
    auVar206._20_4_ = auVar206._0_4_;
    auVar206._24_4_ = auVar206._0_4_;
    auVar206._28_4_ = auVar206._0_4_;
    auVar102 = vfmadd132ps_fma(auVar206,auVar181,_DAT_01faff20);
    auVar121 = ZEXT1632(auVar102);
    local_400[0] = (RTCHitN)auVar121[0];
    local_400[1] = (RTCHitN)auVar121[1];
    local_400[2] = (RTCHitN)auVar121[2];
    local_400[3] = (RTCHitN)auVar121[3];
    local_400[4] = (RTCHitN)auVar121[4];
    local_400[5] = (RTCHitN)auVar121[5];
    local_400[6] = (RTCHitN)auVar121[6];
    local_400[7] = (RTCHitN)auVar121[7];
    local_400[8] = (RTCHitN)auVar121[8];
    local_400[9] = (RTCHitN)auVar121[9];
    local_400[10] = (RTCHitN)auVar121[10];
    local_400[0xb] = (RTCHitN)auVar121[0xb];
    local_400[0xc] = (RTCHitN)auVar121[0xc];
    local_400[0xd] = (RTCHitN)auVar121[0xd];
    local_400[0xe] = (RTCHitN)auVar121[0xe];
    local_400[0xf] = (RTCHitN)auVar121[0xf];
    local_400[0x10] = (RTCHitN)auVar121[0x10];
    local_400[0x11] = (RTCHitN)auVar121[0x11];
    local_400[0x12] = (RTCHitN)auVar121[0x12];
    local_400[0x13] = (RTCHitN)auVar121[0x13];
    local_400[0x14] = (RTCHitN)auVar121[0x14];
    local_400[0x15] = (RTCHitN)auVar121[0x15];
    local_400[0x16] = (RTCHitN)auVar121[0x16];
    local_400[0x17] = (RTCHitN)auVar121[0x17];
    local_400[0x18] = (RTCHitN)auVar121[0x18];
    local_400[0x19] = (RTCHitN)auVar121[0x19];
    local_400[0x1a] = (RTCHitN)auVar121[0x1a];
    local_400[0x1b] = (RTCHitN)auVar121[0x1b];
    local_400[0x1c] = (RTCHitN)auVar121[0x1c];
    local_400[0x1d] = (RTCHitN)auVar121[0x1d];
    local_400[0x1e] = (RTCHitN)auVar121[0x1e];
    local_400[0x1f] = (RTCHitN)auVar121[0x1f];
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_400 + (ulong)uVar164 * 4);
    uVar93 = (ulong)uVar101;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }